

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O0

void __thiscall
GraphMaker::new_graph_from_kmerlist_128
          (GraphMaker *this,vector<unsigned___int128,_std::allocator<unsigned___int128>_> *kmerlist,
          uint8_t k)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [11];
  undefined1 auVar22 [11];
  undefined1 auVar23 [11];
  undefined1 auVar24 [11];
  undefined1 auVar25 [11];
  undefined1 auVar26 [11];
  undefined1 auVar27 [11];
  undefined1 auVar28 [11];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [13];
  undefined1 auVar38 [13];
  undefined1 auVar39 [13];
  undefined1 auVar40 [13];
  undefined1 auVar41 [13];
  undefined1 auVar42 [13];
  undefined1 auVar43 [13];
  undefined1 auVar44 [13];
  undefined1 auVar45 [14];
  undefined1 auVar46 [14];
  undefined1 auVar47 [14];
  undefined1 auVar48 [14];
  undefined1 auVar49 [14];
  undefined1 auVar50 [14];
  undefined1 auVar51 [14];
  undefined1 auVar52 [14];
  undefined1 kmer [16];
  _Bit_reference __y;
  _Bit_reference __x;
  __normal_iterator<std::pair<unsigned___int128,_long>_*,_std::vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>_>
  __first;
  __normal_iterator<std::pair<unsigned___int128,_long>_*,_std::vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>_>
  __first_00;
  __normal_iterator<const_unsigned___int128_*,_std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>_>
  __last;
  __normal_iterator<const_unsigned___int128_*,_std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>_>
  __last_00;
  __normal_iterator<const_unsigned___int128_*,_std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>_>
  __last_01;
  undefined1 VAL [16];
  undefined1 VAL_00 [16];
  undefined1 VAL_01 [16];
  undefined1 VAL_02 [16];
  undefined1 VAL_03 [16];
  undefined1 VAL_04 [16];
  undefined1 VAL_05 [16];
  undefined1 VAL_06 [16];
  __normal_iterator<const_unsigned___int128_*,_std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>_>
  __first_01;
  __normal_iterator<const_unsigned___int128_*,_std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>_>
  __first_02;
  __normal_iterator<const_unsigned___int128_*,_std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>_>
  __first_03;
  undefined1 kmer_00 [16];
  undefined1 kmer_01 [16];
  undefined1 kmer_02 [16];
  undefined1 kmer_03 [16];
  undefined1 kmer_04 [16];
  undefined1 kmer_05 [16];
  undefined1 kmer_06 [16];
  undefined1 kmer_07 [16];
  undefined1 kmer_08 [16];
  undefined1 kmer_09 [16];
  undefined1 kmer_10 [16];
  undefined1 kmer_11 [16];
  undefined1 kmer_12 [16];
  undefined1 kmer_13 [16];
  undefined1 kmer_14 [16];
  undefined1 kmer_15 [16];
  undefined1 kmer_16 [16];
  undefined1 kmer_17 [16];
  undefined1 kmer_18 [16];
  undefined1 kmer_19 [16];
  Support support;
  undefined1 kmer_20 [16];
  bool bVar53;
  ostream *poVar54;
  size_type sVar55;
  const_reference pvVar56;
  reference pvVar57;
  reference pvVar58;
  __uint128_t *p_Var59;
  ostream *poVar60;
  ostream *kmerlist_00;
  ostream *poVar61;
  reference pvVar62;
  DistanceGraph *pDVar63;
  reference pvVar64;
  reference pvVar65;
  reference pvVar66;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  vector<unsigned___int128,_std::allocator<unsigned___int128>_> *in_RSI;
  long *in_RDI;
  char cVar67;
  char cVar68;
  char cVar69;
  char cVar70;
  char cVar71;
  char cVar72;
  char cVar73;
  char cVar74;
  char cVar75;
  char cVar76;
  char cVar77;
  char cVar78;
  char cVar79;
  char cVar80;
  char cVar81;
  byte bVar82;
  reference rVar83;
  uint64_t oidx;
  pair<unsigned___int128,_long> *i_2;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  *__range1;
  uint64_t next_out_idx;
  vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
  last;
  vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
  first;
  uint64_t nid;
  CStringKMerFactory128 skf_ovl;
  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  out;
  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  in;
  value_type current_kmer_1;
  uchar nucleotides_1 [4];
  vector<klidxs128,_std::allocator<klidxs128>_> fwn;
  value_type start_kmer_1;
  uint64_t start_kmer_idx_1;
  __uint128_t ccurr;
  int nn_2;
  value_type c_2;
  uchar nucleotides [4];
  uint64_t current_idx;
  value_type current_kmer;
  reference end_fw;
  reference end_bw;
  value_type start_kmer;
  uint64_t start_kmer_idx;
  value_type *nc_1;
  difference_type ni_1;
  __uint128_t cnext_1;
  value_type_conflict5 next_1;
  int nn_1;
  value_type *nc;
  difference_type ni;
  __uint128_t cnext;
  value_type_conflict5 next;
  int nn;
  value_type *c_1;
  uint64_t i_1;
  array<unsigned___int128,_4UL> bns;
  value_type *c;
  array<unsigned___int128,_4UL> fns;
  uint64_t i;
  vector<bool,_std::allocator<bool>_> is_end_bw;
  vector<bool,_std::allocator<bool>_> is_end_fw;
  vector<kcontext,_std::allocator<kcontext>_> kcontextlist;
  vector<bool,_std::allocator<bool>_> used_kmers;
  string s;
  undefined7 in_stack_ffffffffffffefc8;
  uint8_t in_stack_ffffffffffffefcf;
  SequenceDistanceGraph *in_stack_ffffffffffffefd0;
  __normal_iterator<std::pair<unsigned___int128,_long>_*,_std::vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>_>
  in_stack_ffffffffffffefd8;
  undefined7 in_stack_ffffffffffffefe0;
  NodeStatus in_stack_ffffffffffffefe7;
  Node *in_stack_ffffffffffffefe8;
  undefined4 in_stack_ffffffffffffeff0;
  undefined4 in_stack_ffffffffffffeff4;
  undefined4 in_stack_ffffffffffffeff8;
  LogLevels in_stack_ffffffffffffeffc;
  undefined7 in_stack_fffffffffffff000;
  undefined1 in_stack_fffffffffffff007;
  undefined7 in_stack_fffffffffffff008;
  undefined7 uVar84;
  uint8_t in_stack_fffffffffffff00f;
  undefined1 uVar85;
  undefined7 in_stack_fffffffffffff010;
  undefined1 in_stack_fffffffffffff017;
  undefined4 in_stack_fffffffffffff018;
  int in_stack_fffffffffffff01c;
  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  *pvVar86;
  undefined1 *dest;
  reference in_stack_fffffffffffff028;
  DistanceGraph *this_00;
  undefined1 *puVar87;
  Node *in_stack_fffffffffffff050;
  undefined7 in_stack_fffffffffffff0c8;
  undefined1 in_stack_fffffffffffff0cf;
  vector<klidxs128,_std::allocator<klidxs128>_> *in_stack_fffffffffffff0d8;
  Support local_ca0;
  size_type local_c90;
  reference local_c88;
  pair<unsigned___int128,_long> *local_c80;
  __normal_iterator<std::pair<unsigned___int128,_long>_*,_std::vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>_>
  local_c78;
  undefined1 *local_c70;
  size_type local_c68;
  pair<unsigned___int128,_long> *local_c60;
  pair<unsigned___int128,_long> *local_c58;
  pair<unsigned___int128,_long> *local_c50;
  pair<unsigned___int128,_long> *local_c48;
  long local_c40;
  long local_c38;
  string local_c30 [32];
  string local_c10 [32];
  vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
  local_bf0;
  vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
  local_bd8;
  DistanceGraph *local_bc0;
  CStringKMerFactory128 local_bb8;
  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  local_960;
  undefined1 local_948 [80];
  reference local_8f8;
  undefined8 local_8e8;
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  string local_8c8 [32];
  reference local_8a8;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined4 local_884;
  vector<klidxs128,_std::allocator<klidxs128>_> local_880;
  undefined8 local_868;
  undefined8 uStack_860;
  reference local_858;
  ulong local_848;
  reference local_808;
  reference local_7f8;
  reference local_7e8;
  reference local_7d8;
  unsigned___int128 *local_7c8;
  unsigned___int128 *local_7c0;
  unsigned___int128 *local_7b8;
  unsigned___int128 *local_7b0;
  __uint128_t *local_7a8;
  __uint128_t *local_798;
  undefined8 local_790;
  undefined8 local_788;
  undefined8 uStack_780;
  __uint128_t *local_778;
  undefined8 local_770;
  undefined8 local_728;
  char cStack_720;
  char cStack_71f;
  char cStack_71e;
  char cStack_71d;
  char cStack_71c;
  char cStack_71b;
  char cStack_71a;
  char cStack_719;
  __uint128_t *local_718;
  undefined8 local_710;
  undefined4 local_704;
  value_type local_700;
  undefined4 local_6fc;
  __uint128_t *local_6f8;
  undefined8 local_6f0;
  string local_6e8 [32];
  reference local_6c8;
  reference local_6b8;
  __uint128_t *local_6a8;
  __uint128_t *local_698;
  undefined8 local_690;
  reference local_680;
  size_type local_670;
  undefined8 local_668;
  undefined8 uStack_660;
  reference local_658;
  __uint128_t *local_648;
  undefined8 local_640;
  string local_638 [32];
  reference local_618;
  reference local_608;
  __uint128_t *local_5f8;
  undefined8 local_5f0;
  reference local_5e0;
  ulong local_5d0;
  reference local_5c8;
  reference local_5b8;
  reference local_5a8;
  unsigned___int128 *local_5a0;
  unsigned___int128 *local_598;
  unsigned___int128 *local_590;
  unsigned___int128 *local_588;
  size_type local_580;
  __uint128_t *local_578;
  undefined8 local_568;
  undefined8 local_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 local_540;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined4 local_4dc;
  reference local_4d8;
  reference local_4c8;
  reference local_4b8;
  reference local_4a8;
  unsigned___int128 *local_4a0;
  unsigned___int128 *local_498;
  unsigned___int128 *local_490;
  unsigned___int128 *local_488;
  size_type local_480;
  __uint128_t *local_478;
  undefined8 local_468;
  undefined8 local_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 local_440;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined4 local_3dc;
  reference local_3d8;
  reference local_3c8;
  ulong local_3c0;
  __uint128_t *local_3b8;
  __uint128_t *local_3a8;
  undefined8 local_398;
  undefined8 local_390;
  __uint128_t *local_388;
  __uint128_t *local_378;
  undefined8 local_368;
  undefined8 local_360;
  __uint128_t *local_358;
  __uint128_t *local_348;
  undefined8 local_338;
  undefined8 local_330;
  __uint128_t *local_328;
  __uint128_t *local_318;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  __uint128_t *local_2a8;
  __uint128_t *local_298;
  undefined8 local_288;
  undefined8 local_280;
  __uint128_t *local_278;
  __uint128_t *local_268;
  undefined8 local_258;
  undefined8 local_250;
  __uint128_t *local_248;
  __uint128_t *local_238;
  undefined8 local_228;
  undefined8 local_220;
  __uint128_t *local_218;
  __uint128_t *local_208;
  undefined8 local_1f8;
  undefined8 local_1f0;
  reference local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  ulong local_180;
  vector<kcontext,_std::allocator<kcontext>_> local_110 [3];
  string local_c8 [32];
  string local_a8 [55];
  allocator local_71;
  string local_70 [96];
  vector<unsigned___int128,_std::allocator<unsigned___int128>_> *local_10;
  
  local_10 = in_RSI;
  std::vector<Node,_std::allocator<Node>_>::clear((vector<Node,_std::allocator<Node>_> *)0x45649c);
  std::
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ::clear((vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
           *)0x4564b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x4564c7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",&local_71);
  Node::Node((Node *)CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
             &in_stack_ffffffffffffefe8->sequence,in_stack_ffffffffffffefe7);
  SequenceDistanceGraph::add_node
            (in_stack_ffffffffffffefd0,
             (Node *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
  Node::~Node((Node *)0x45654d);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  poVar54 = sdglib::OutputLog(in_stack_ffffffffffffeffc,
                              SUB41((uint)in_stack_ffffffffffffeff8 >> 0x18,0));
  poVar54 = std::operator<<(poVar54,"Constructing Graph from ");
  sVar55 = std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::size(local_10);
  poVar54 = (ostream *)std::ostream::operator<<(poVar54,sVar55);
  poVar54 = std::operator<<(poVar54," ");
  std::__cxx11::to_string(in_stack_fffffffffffff01c);
  poVar54 = std::operator<<(poVar54,local_a8);
  poVar54 = std::operator<<(poVar54,"-mers");
  std::ostream::operator<<(poVar54,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::string(local_c8);
  std::__cxx11::string::reserve((ulong)local_c8);
  std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::size(local_10);
  std::allocator<bool>::allocator((allocator<bool> *)0x45668e);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT17(in_stack_ffffffffffffefe7,in_stack_ffffffffffffefe0),
             (size_type)in_stack_ffffffffffffefd8._M_current,
             (allocator_type *)in_stack_ffffffffffffefd0);
  std::allocator<bool>::~allocator((allocator<bool> *)0x4566ba);
  std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::size(local_10);
  std::allocator<kcontext>::allocator((allocator<kcontext> *)0x4566e4);
  std::vector<kcontext,_std::allocator<kcontext>_>::vector
            ((vector<kcontext,_std::allocator<kcontext>_> *)
             CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
             (size_type)in_stack_ffffffffffffefe8,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffefe7,in_stack_ffffffffffffefe0));
  std::allocator<kcontext>::~allocator((allocator<kcontext> *)0x456710);
  std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::size(local_10);
  std::allocator<bool>::allocator((allocator<bool> *)0x45673a);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT17(in_stack_ffffffffffffefe7,in_stack_ffffffffffffefe0),
             (size_type)in_stack_ffffffffffffefd8._M_current,
             (allocator_type *)in_stack_ffffffffffffefd0);
  std::allocator<bool>::~allocator((allocator<bool> *)0x456766);
  std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::size(local_10);
  std::allocator<bool>::allocator((allocator<bool> *)0x456790);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT17(in_stack_ffffffffffffefe7,in_stack_ffffffffffffefe0),
             (size_type)in_stack_ffffffffffffefd8._M_current,
             (allocator_type *)in_stack_ffffffffffffefd0);
  std::allocator<bool>::~allocator((allocator<bool> *)0x4567bc);
  poVar54 = sdglib::OutputLog(in_stack_ffffffffffffeffc,
                              SUB41((uint)in_stack_ffffffffffffeff8 >> 0x18,0));
  poVar54 = std::operator<<(poVar54,"Finding neighbours");
  std::ostream::operator<<(poVar54,std::endl<char,std::char_traits<char>>);
  for (local_180 = 0; uVar3 = local_180,
      sVar55 = std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::size(local_10),
      uVar3 < sVar55; local_180 = local_180 + 1) {
    pvVar56 = std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::operator[]
                        (local_10,local_180);
    local_1d8 = (undefined8)*pvVar56;
    local_1d0 = *(undefined8 *)((long)pvVar56 + 8);
    kmer_00[7] = in_stack_fffffffffffff007;
    kmer_00._0_7_ = in_stack_fffffffffffff000;
    kmer_00._8_7_ = in_stack_fffffffffffff008;
    kmer_00[0xf] = in_stack_fffffffffffff00f;
    kmer_fw_neighbours128((__uint128_t)kmer_00,(uint8_t)(in_stack_ffffffffffffeffc >> 0x18));
    local_1e0 = std::vector<kcontext,_std::allocator<kcontext>_>::operator[](local_110,local_180);
    *(byte *)local_1e0 = *(byte *)local_1e0 & 0xf0;
    *(byte *)local_1e0 = *(byte *)local_1e0 & 0xf;
    pvVar57 = std::array<unsigned___int128,_4UL>::operator[]
                        ((array<unsigned___int128,_4UL> *)in_stack_ffffffffffffefd0,
                         CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
    local_1f8 = (undefined8)*pvVar57;
    local_1f0 = *(undefined8 *)((long)pvVar57 + 8);
    kmer_08[7] = in_stack_fffffffffffff017;
    kmer_08._0_7_ = in_stack_fffffffffffff010;
    kmer_08._8_4_ = in_stack_fffffffffffff018;
    kmer_08._12_4_ = in_stack_fffffffffffff01c;
    local_218 = kmer_cannonical128((__uint128_t)kmer_08,in_stack_fffffffffffff00f);
    VAL._4_4_ = in_stack_ffffffffffffeff4;
    VAL._0_4_ = in_stack_ffffffffffffeff0;
    VAL._8_4_ = in_stack_ffffffffffffeff8;
    VAL._12_4_ = in_stack_ffffffffffffeffc;
    local_208 = local_218;
    bVar53 = in_sorted_vector<unsigned__int128>
                       ((vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
                        CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),
                        (unsigned___int128)VAL);
    if (bVar53) {
      *(byte *)local_1e0 = *(byte *)local_1e0 & 0xfe | 1;
    }
    pvVar57 = std::array<unsigned___int128,_4UL>::operator[]
                        ((array<unsigned___int128,_4UL> *)in_stack_ffffffffffffefd0,
                         CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
    local_228 = (undefined8)*pvVar57;
    local_220 = *(undefined8 *)((long)pvVar57 + 8);
    kmer_09[7] = in_stack_fffffffffffff017;
    kmer_09._0_7_ = in_stack_fffffffffffff010;
    kmer_09._8_4_ = in_stack_fffffffffffff018;
    kmer_09._12_4_ = in_stack_fffffffffffff01c;
    local_248 = kmer_cannonical128((__uint128_t)kmer_09,in_stack_fffffffffffff00f);
    VAL_00._4_4_ = in_stack_ffffffffffffeff4;
    VAL_00._0_4_ = in_stack_ffffffffffffeff0;
    VAL_00._8_4_ = in_stack_ffffffffffffeff8;
    VAL_00._12_4_ = in_stack_ffffffffffffeffc;
    local_238 = local_248;
    bVar53 = in_sorted_vector<unsigned__int128>
                       ((vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
                        CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),
                        (unsigned___int128)VAL_00);
    if (bVar53) {
      *(byte *)local_1e0 = *(byte *)local_1e0 & 0xfd | 2;
    }
    pvVar57 = std::array<unsigned___int128,_4UL>::operator[]
                        ((array<unsigned___int128,_4UL> *)in_stack_ffffffffffffefd0,
                         CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
    local_258 = (undefined8)*pvVar57;
    local_250 = *(undefined8 *)((long)pvVar57 + 8);
    kmer_10[7] = in_stack_fffffffffffff017;
    kmer_10._0_7_ = in_stack_fffffffffffff010;
    kmer_10._8_4_ = in_stack_fffffffffffff018;
    kmer_10._12_4_ = in_stack_fffffffffffff01c;
    local_278 = kmer_cannonical128((__uint128_t)kmer_10,in_stack_fffffffffffff00f);
    VAL_01._4_4_ = in_stack_ffffffffffffeff4;
    VAL_01._0_4_ = in_stack_ffffffffffffeff0;
    VAL_01._8_4_ = in_stack_ffffffffffffeff8;
    VAL_01._12_4_ = in_stack_ffffffffffffeffc;
    local_268 = local_278;
    bVar53 = in_sorted_vector<unsigned__int128>
                       ((vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
                        CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),
                        (unsigned___int128)VAL_01);
    if (bVar53) {
      *(byte *)local_1e0 = *(byte *)local_1e0 & 0xfb | 4;
    }
    pvVar57 = std::array<unsigned___int128,_4UL>::operator[]
                        ((array<unsigned___int128,_4UL> *)in_stack_ffffffffffffefd0,
                         CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
    local_288 = (undefined8)*pvVar57;
    local_280 = *(undefined8 *)((long)pvVar57 + 8);
    kmer_11[7] = in_stack_fffffffffffff017;
    kmer_11._0_7_ = in_stack_fffffffffffff010;
    kmer_11._8_4_ = in_stack_fffffffffffff018;
    kmer_11._12_4_ = in_stack_fffffffffffff01c;
    local_2a8 = kmer_cannonical128((__uint128_t)kmer_11,in_stack_fffffffffffff00f);
    VAL_02._4_4_ = in_stack_ffffffffffffeff4;
    VAL_02._0_4_ = in_stack_ffffffffffffeff0;
    VAL_02._8_4_ = in_stack_ffffffffffffeff8;
    VAL_02._12_4_ = in_stack_ffffffffffffeffc;
    local_298 = local_2a8;
    bVar53 = in_sorted_vector<unsigned__int128>
                       ((vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
                        CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),
                        (unsigned___int128)VAL_02);
    if (bVar53) {
      *(byte *)local_1e0 = *(byte *)local_1e0 & 0xf7 | 8;
    }
    pvVar56 = std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::operator[]
                        (local_10,local_180);
    local_2f8 = (undefined8)*pvVar56;
    local_2f0 = *(undefined8 *)((long)pvVar56 + 8);
    kmer_01[7] = in_stack_fffffffffffff007;
    kmer_01._0_7_ = in_stack_fffffffffffff000;
    kmer_01._8_7_ = in_stack_fffffffffffff008;
    kmer_01[0xf] = in_stack_fffffffffffff00f;
    kmer_bw_neighbours128((__uint128_t)kmer_01,(uint8_t)(in_stack_ffffffffffffeffc >> 0x18));
    pvVar57 = std::array<unsigned___int128,_4UL>::operator[]
                        ((array<unsigned___int128,_4UL> *)in_stack_ffffffffffffefd0,
                         CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
    local_308 = (undefined8)*pvVar57;
    local_300 = *(undefined8 *)((long)pvVar57 + 8);
    kmer_12[7] = in_stack_fffffffffffff017;
    kmer_12._0_7_ = in_stack_fffffffffffff010;
    kmer_12._8_4_ = in_stack_fffffffffffff018;
    kmer_12._12_4_ = in_stack_fffffffffffff01c;
    local_328 = kmer_cannonical128((__uint128_t)kmer_12,in_stack_fffffffffffff00f);
    VAL_03._4_4_ = in_stack_ffffffffffffeff4;
    VAL_03._0_4_ = in_stack_ffffffffffffeff0;
    VAL_03._8_4_ = in_stack_ffffffffffffeff8;
    VAL_03._12_4_ = in_stack_ffffffffffffeffc;
    local_318 = local_328;
    bVar53 = in_sorted_vector<unsigned__int128>
                       ((vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
                        CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),
                        (unsigned___int128)VAL_03);
    if (bVar53) {
      *(byte *)local_1e0 = *(byte *)local_1e0 & 0xef | 0x10;
    }
    pvVar57 = std::array<unsigned___int128,_4UL>::operator[]
                        ((array<unsigned___int128,_4UL> *)in_stack_ffffffffffffefd0,
                         CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
    local_338 = (undefined8)*pvVar57;
    local_330 = *(undefined8 *)((long)pvVar57 + 8);
    kmer_13[7] = in_stack_fffffffffffff017;
    kmer_13._0_7_ = in_stack_fffffffffffff010;
    kmer_13._8_4_ = in_stack_fffffffffffff018;
    kmer_13._12_4_ = in_stack_fffffffffffff01c;
    local_358 = kmer_cannonical128((__uint128_t)kmer_13,in_stack_fffffffffffff00f);
    VAL_04._4_4_ = in_stack_ffffffffffffeff4;
    VAL_04._0_4_ = in_stack_ffffffffffffeff0;
    VAL_04._8_4_ = in_stack_ffffffffffffeff8;
    VAL_04._12_4_ = in_stack_ffffffffffffeffc;
    local_348 = local_358;
    bVar53 = in_sorted_vector<unsigned__int128>
                       ((vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
                        CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),
                        (unsigned___int128)VAL_04);
    if (bVar53) {
      *(byte *)local_1e0 = *(byte *)local_1e0 & 0xdf | 0x20;
    }
    pvVar57 = std::array<unsigned___int128,_4UL>::operator[]
                        ((array<unsigned___int128,_4UL> *)in_stack_ffffffffffffefd0,
                         CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
    local_368 = (undefined8)*pvVar57;
    local_360 = *(undefined8 *)((long)pvVar57 + 8);
    kmer_14[7] = in_stack_fffffffffffff017;
    kmer_14._0_7_ = in_stack_fffffffffffff010;
    kmer_14._8_4_ = in_stack_fffffffffffff018;
    kmer_14._12_4_ = in_stack_fffffffffffff01c;
    local_388 = kmer_cannonical128((__uint128_t)kmer_14,in_stack_fffffffffffff00f);
    VAL_05._4_4_ = in_stack_ffffffffffffeff4;
    VAL_05._0_4_ = in_stack_ffffffffffffeff0;
    VAL_05._8_4_ = in_stack_ffffffffffffeff8;
    VAL_05._12_4_ = in_stack_ffffffffffffeffc;
    local_378 = local_388;
    bVar53 = in_sorted_vector<unsigned__int128>
                       ((vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
                        CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),
                        (unsigned___int128)VAL_05);
    if (bVar53) {
      *(byte *)local_1e0 = *(byte *)local_1e0 & 0xbf | 0x40;
    }
    pvVar57 = std::array<unsigned___int128,_4UL>::operator[]
                        ((array<unsigned___int128,_4UL> *)in_stack_ffffffffffffefd0,
                         CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
    local_398 = (undefined8)*pvVar57;
    local_390 = *(undefined8 *)((long)pvVar57 + 8);
    kmer_15[7] = in_stack_fffffffffffff017;
    kmer_15._0_7_ = in_stack_fffffffffffff010;
    kmer_15._8_4_ = in_stack_fffffffffffff018;
    kmer_15._12_4_ = in_stack_fffffffffffff01c;
    local_3b8 = kmer_cannonical128((__uint128_t)kmer_15,in_stack_fffffffffffff00f);
    VAL_06._4_4_ = in_stack_ffffffffffffeff4;
    VAL_06._0_4_ = in_stack_ffffffffffffeff0;
    VAL_06._8_4_ = in_stack_ffffffffffffeff8;
    VAL_06._12_4_ = in_stack_ffffffffffffeffc;
    local_3a8 = local_3b8;
    bVar53 = in_sorted_vector<unsigned__int128>
                       ((vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
                        CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),
                        (unsigned___int128)VAL_06);
    if (bVar53) {
      *(byte *)local_1e0 = *(byte *)local_1e0 & 0x7f | 0x80;
    }
  }
  poVar54 = sdglib::OutputLog(in_stack_ffffffffffffeffc,
                              SUB41((uint)in_stack_ffffffffffffeff8 >> 0x18,0));
  poVar54 = std::operator<<(poVar54,"Marking ends");
  std::ostream::operator<<(poVar54,std::endl<char,std::char_traits<char>>);
  local_3c0 = 0;
  while( true ) {
    uVar3 = local_3c0;
    sVar55 = std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::size(local_10);
    if (sVar55 <= uVar3) break;
    local_3c8 = std::vector<kcontext,_std::allocator<kcontext>_>::operator[](local_110,local_3c0);
    if ((((*(byte *)local_3c8 >> 4 == 1) || (*(byte *)local_3c8 >> 4 == 2)) ||
        (*(byte *)local_3c8 >> 4 == 4)) || (*(byte *)local_3c8 >> 4 == 8)) {
      if ((*(byte *)local_3c8 >> 4 & 1) == 0) {
        if ((*(byte *)local_3c8 >> 5 & 1) == 0) {
          if ((*(byte *)local_3c8 >> 6 & 1) == 0) {
            if (*(char *)local_3c8 < '\0') {
              local_3dc = 3;
            }
          }
          else {
            local_3dc = 2;
          }
        }
        else {
          local_3dc = 1;
        }
      }
      else {
        local_3dc = 0;
      }
      pvVar56 = std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::operator[]
                          (local_10,local_3c0);
      local_448 = (undefined8)*pvVar56;
      local_440 = *(undefined8 *)((long)pvVar56 + 8);
      kmer_02[7] = in_stack_fffffffffffff007;
      kmer_02._0_7_ = in_stack_fffffffffffff000;
      kmer_02._8_7_ = in_stack_fffffffffffff008;
      kmer_02[0xf] = in_stack_fffffffffffff00f;
      kmer_bw_neighbours128((__uint128_t)kmer_02,(uint8_t)(in_stack_ffffffffffffeffc >> 0x18));
      pvVar57 = std::array<unsigned___int128,_4UL>::operator[]
                          ((array<unsigned___int128,_4UL> *)in_stack_ffffffffffffefd0,
                           CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
      local_468 = (undefined8)*pvVar57;
      local_460 = *(undefined8 *)((long)pvVar57 + 8);
      kmer_16[7] = in_stack_fffffffffffff017;
      kmer_16._0_7_ = in_stack_fffffffffffff010;
      kmer_16._8_4_ = in_stack_fffffffffffff018;
      kmer_16._12_4_ = in_stack_fffffffffffff01c;
      local_3f8 = local_468;
      uStack_3f0 = local_460;
      local_478 = kmer_cannonical128((__uint128_t)kmer_16,in_stack_fffffffffffff00f);
      local_458 = local_478;
      uStack_450 = extraout_RDX;
      local_490 = (unsigned___int128 *)
                  std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::begin
                            ((vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
                             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
      local_498 = (unsigned___int128 *)
                  std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::end
                            ((vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
                             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
      __first_01._M_current._4_4_ = in_stack_ffffffffffffeffc;
      __first_01._M_current._0_4_ = in_stack_ffffffffffffeff8;
      __last._M_current._4_4_ = in_stack_ffffffffffffeff4;
      __last._M_current._0_4_ = in_stack_ffffffffffffeff0;
      local_488 = (unsigned___int128 *)
                  std::
                  lower_bound<__gnu_cxx::__normal_iterator<unsigned__int128_const*,std::vector<unsigned__int128,std::allocator<unsigned__int128>>>,unsigned__int128>
                            (__first_01,__last,(unsigned___int128 *)in_stack_ffffffffffffefe8);
      local_4a0 = (unsigned___int128 *)
                  std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::begin
                            ((vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
                             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
      local_480 = __gnu_cxx::operator-
                            ((__normal_iterator<const_unsigned___int128_*,_std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>_>
                              *)in_stack_ffffffffffffefd0,
                             (__normal_iterator<const_unsigned___int128_*,_std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>_>
                              *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
      local_4a8 = std::vector<kcontext,_std::allocator<kcontext>_>::operator[](local_110,local_480);
      cVar67 = -(local_3f8._2_1_ == local_458._2_1_);
      cVar68 = -(local_3f8._3_1_ == local_458._3_1_);
      cVar69 = -(local_3f8._4_1_ == local_458._4_1_);
      cVar70 = -(local_3f8._5_1_ == local_458._5_1_);
      cVar71 = -(local_3f8._6_1_ == local_458._6_1_);
      cVar72 = -(local_3f8._7_1_ == local_458._7_1_);
      cVar73 = -((char)uStack_3f0 == (char)uStack_450);
      cVar74 = -(uStack_3f0._1_1_ == uStack_450._1_1_);
      cVar75 = -(uStack_3f0._2_1_ == uStack_450._2_1_);
      cVar76 = -(uStack_3f0._3_1_ == uStack_450._3_1_);
      cVar77 = -(uStack_3f0._4_1_ == uStack_450._4_1_);
      cVar78 = -(uStack_3f0._5_1_ == uStack_450._5_1_);
      cVar80 = -(uStack_3f0._6_1_ == uStack_450._6_1_);
      bVar82 = -(uStack_3f0._7_1_ == uStack_450._7_1_);
      auVar9[1] = -(local_3f8._1_1_ == local_458._1_1_);
      auVar9[0] = -((char)local_3f8 == (char)local_458);
      auVar9[2] = cVar67;
      auVar9[3] = cVar68;
      auVar9[4] = cVar69;
      auVar9[5] = cVar70;
      auVar9[6] = cVar71;
      auVar9[7] = cVar72;
      auVar9[8] = cVar73;
      auVar9[9] = cVar74;
      auVar9[10] = cVar75;
      auVar9[0xb] = cVar76;
      auVar9[0xc] = cVar77;
      auVar9[0xd] = cVar78;
      auVar9[0xe] = cVar80;
      auVar9[0xf] = bVar82;
      auVar10[1] = -(local_3f8._1_1_ == local_458._1_1_);
      auVar10[0] = -((char)local_3f8 == (char)local_458);
      auVar10[2] = cVar67;
      auVar10[3] = cVar68;
      auVar10[4] = cVar69;
      auVar10[5] = cVar70;
      auVar10[6] = cVar71;
      auVar10[7] = cVar72;
      auVar10[8] = cVar73;
      auVar10[9] = cVar74;
      auVar10[10] = cVar75;
      auVar10[0xb] = cVar76;
      auVar10[0xc] = cVar77;
      auVar10[0xd] = cVar78;
      auVar10[0xe] = cVar80;
      auVar10[0xf] = bVar82;
      auVar45[1] = cVar68;
      auVar45[0] = cVar67;
      auVar45[2] = cVar69;
      auVar45[3] = cVar70;
      auVar45[4] = cVar71;
      auVar45[5] = cVar72;
      auVar45[6] = cVar73;
      auVar45[7] = cVar74;
      auVar45[8] = cVar75;
      auVar45[9] = cVar76;
      auVar45[10] = cVar77;
      auVar45[0xb] = cVar78;
      auVar45[0xc] = cVar80;
      auVar45[0xd] = bVar82;
      auVar37[1] = cVar69;
      auVar37[0] = cVar68;
      auVar37[2] = cVar70;
      auVar37[3] = cVar71;
      auVar37[4] = cVar72;
      auVar37[5] = cVar73;
      auVar37[6] = cVar74;
      auVar37[7] = cVar75;
      auVar37[8] = cVar76;
      auVar37[9] = cVar77;
      auVar37[10] = cVar78;
      auVar37[0xb] = cVar80;
      auVar37[0xc] = bVar82;
      auVar29[1] = cVar70;
      auVar29[0] = cVar69;
      auVar29[2] = cVar71;
      auVar29[3] = cVar72;
      auVar29[4] = cVar73;
      auVar29[5] = cVar74;
      auVar29[6] = cVar75;
      auVar29[7] = cVar76;
      auVar29[8] = cVar77;
      auVar29[9] = cVar78;
      auVar29[10] = cVar80;
      auVar29[0xb] = bVar82;
      auVar21[1] = cVar71;
      auVar21[0] = cVar70;
      auVar21[2] = cVar72;
      auVar21[3] = cVar73;
      auVar21[4] = cVar74;
      auVar21[5] = cVar75;
      auVar21[6] = cVar76;
      auVar21[7] = cVar77;
      auVar21[8] = cVar78;
      auVar21[9] = cVar80;
      auVar21[10] = bVar82;
      if ((((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB141(auVar45 >> 7,0) & 1) << 2 |
                     (ushort)(SUB131(auVar37 >> 7,0) & 1) << 3 |
                     (ushort)(SUB121(auVar29 >> 7,0) & 1) << 4 |
                     (ushort)(SUB111(auVar21 >> 7,0) & 1) << 5 |
                     (ushort)((byte)(CONCAT19(bVar82,CONCAT18(cVar80,CONCAT17(cVar78,CONCAT16(cVar77
                                                  ,CONCAT15(cVar76,CONCAT14(cVar75,CONCAT13(cVar74,
                                                  CONCAT12(cVar73,CONCAT11(cVar72,cVar71))))))))) >>
                                    7) & 1) << 6 |
                     (ushort)((byte)(CONCAT18(bVar82,CONCAT17(cVar80,CONCAT16(cVar78,CONCAT15(cVar77
                                                  ,CONCAT14(cVar76,CONCAT13(cVar75,CONCAT12(cVar74,
                                                  CONCAT11(cVar73,cVar72)))))))) >> 7) & 1) << 7 |
                    (ushort)(bVar82 >> 7) << 0xf) == 0xffff) && (((uint)*local_4a8 & 0xf) != 1)) &&
         ((((uint)*local_4a8 & 0xf) != 2 &&
          ((((uint)*local_4a8 & 0xf) != 4 && (((uint)*local_4a8 & 0xf) != 8)))))) {
        rVar83 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)
                            CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                            (size_type)in_stack_ffffffffffffefe8);
        local_4b8 = rVar83;
        std::_Bit_reference::operator=(&local_4b8,true);
      }
      cVar67 = -(local_3f8._2_1_ == local_458._2_1_);
      cVar68 = -(local_3f8._3_1_ == local_458._3_1_);
      cVar69 = -(local_3f8._4_1_ == local_458._4_1_);
      cVar70 = -(local_3f8._5_1_ == local_458._5_1_);
      cVar71 = -(local_3f8._6_1_ == local_458._6_1_);
      cVar72 = -(local_3f8._7_1_ == local_458._7_1_);
      cVar73 = -((char)uStack_3f0 == (char)uStack_450);
      cVar74 = -(uStack_3f0._1_1_ == uStack_450._1_1_);
      cVar75 = -(uStack_3f0._2_1_ == uStack_450._2_1_);
      cVar76 = -(uStack_3f0._3_1_ == uStack_450._3_1_);
      cVar77 = -(uStack_3f0._4_1_ == uStack_450._4_1_);
      cVar78 = -(uStack_3f0._5_1_ == uStack_450._5_1_);
      cVar80 = -(uStack_3f0._6_1_ == uStack_450._6_1_);
      bVar82 = -(uStack_3f0._7_1_ == uStack_450._7_1_);
      auVar11[1] = -(local_3f8._1_1_ == local_458._1_1_);
      auVar11[0] = -((char)local_3f8 == (char)local_458);
      auVar11[2] = cVar67;
      auVar11[3] = cVar68;
      auVar11[4] = cVar69;
      auVar11[5] = cVar70;
      auVar11[6] = cVar71;
      auVar11[7] = cVar72;
      auVar11[8] = cVar73;
      auVar11[9] = cVar74;
      auVar11[10] = cVar75;
      auVar11[0xb] = cVar76;
      auVar11[0xc] = cVar77;
      auVar11[0xd] = cVar78;
      auVar11[0xe] = cVar80;
      auVar11[0xf] = bVar82;
      auVar12[1] = -(local_3f8._1_1_ == local_458._1_1_);
      auVar12[0] = -((char)local_3f8 == (char)local_458);
      auVar12[2] = cVar67;
      auVar12[3] = cVar68;
      auVar12[4] = cVar69;
      auVar12[5] = cVar70;
      auVar12[6] = cVar71;
      auVar12[7] = cVar72;
      auVar12[8] = cVar73;
      auVar12[9] = cVar74;
      auVar12[10] = cVar75;
      auVar12[0xb] = cVar76;
      auVar12[0xc] = cVar77;
      auVar12[0xd] = cVar78;
      auVar12[0xe] = cVar80;
      auVar12[0xf] = bVar82;
      auVar46[1] = cVar68;
      auVar46[0] = cVar67;
      auVar46[2] = cVar69;
      auVar46[3] = cVar70;
      auVar46[4] = cVar71;
      auVar46[5] = cVar72;
      auVar46[6] = cVar73;
      auVar46[7] = cVar74;
      auVar46[8] = cVar75;
      auVar46[9] = cVar76;
      auVar46[10] = cVar77;
      auVar46[0xb] = cVar78;
      auVar46[0xc] = cVar80;
      auVar46[0xd] = bVar82;
      auVar38[1] = cVar69;
      auVar38[0] = cVar68;
      auVar38[2] = cVar70;
      auVar38[3] = cVar71;
      auVar38[4] = cVar72;
      auVar38[5] = cVar73;
      auVar38[6] = cVar74;
      auVar38[7] = cVar75;
      auVar38[8] = cVar76;
      auVar38[9] = cVar77;
      auVar38[10] = cVar78;
      auVar38[0xb] = cVar80;
      auVar38[0xc] = bVar82;
      auVar30[1] = cVar70;
      auVar30[0] = cVar69;
      auVar30[2] = cVar71;
      auVar30[3] = cVar72;
      auVar30[4] = cVar73;
      auVar30[5] = cVar74;
      auVar30[6] = cVar75;
      auVar30[7] = cVar76;
      auVar30[8] = cVar77;
      auVar30[9] = cVar78;
      auVar30[10] = cVar80;
      auVar30[0xb] = bVar82;
      auVar22[1] = cVar71;
      auVar22[0] = cVar70;
      auVar22[2] = cVar72;
      auVar22[3] = cVar73;
      auVar22[4] = cVar74;
      auVar22[5] = cVar75;
      auVar22[6] = cVar76;
      auVar22[7] = cVar77;
      auVar22[8] = cVar78;
      auVar22[9] = cVar80;
      auVar22[10] = bVar82;
      if (((((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar46 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar38 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar30 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar22 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(bVar82,CONCAT18(cVar80,CONCAT17(cVar78,CONCAT16(
                                                  cVar77,CONCAT15(cVar76,CONCAT14(cVar75,CONCAT13(
                                                  cVar74,CONCAT12(cVar73,CONCAT11(cVar72,cVar71)))))
                                                  )))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(bVar82,CONCAT17(cVar80,CONCAT16(cVar78,CONCAT15(
                                                  cVar77,CONCAT14(cVar76,CONCAT13(cVar75,CONCAT12(
                                                  cVar74,CONCAT11(cVar73,cVar72)))))))) >> 7) & 1)
                      << 7 | (ushort)(bVar82 >> 7) << 0xf) != 0xffff) &&
           (*(byte *)local_4a8 >> 4 != 1)) && (*(byte *)local_4a8 >> 4 != 2)) &&
         ((*(byte *)local_4a8 >> 4 != 4 && (*(byte *)local_4a8 >> 4 != 8)))) {
        rVar83 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)
                            CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                            (size_type)in_stack_ffffffffffffefe8);
        local_4c8 = rVar83;
        std::_Bit_reference::operator=(&local_4c8,true);
      }
    }
    else {
      rVar83 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)
                          CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                          (size_type)in_stack_ffffffffffffefe8);
      local_3d8 = rVar83;
      std::_Bit_reference::operator=(&local_3d8,true);
    }
    if (((((uint)*local_3c8 & 0xf) == 1) || (((uint)*local_3c8 & 0xf) == 2)) ||
       ((((uint)*local_3c8 & 0xf) == 4 || (((uint)*local_3c8 & 0xf) == 8)))) {
      if (((uint)*local_3c8 & 1) == 0) {
        if ((*(byte *)local_3c8 >> 1 & 1) == 0) {
          if ((*(byte *)local_3c8 >> 2 & 1) == 0) {
            if ((*(byte *)local_3c8 >> 3 & 1) != 0) {
              local_4dc = 3;
            }
          }
          else {
            local_4dc = 2;
          }
        }
        else {
          local_4dc = 1;
        }
      }
      else {
        local_4dc = 0;
      }
      pvVar56 = std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::operator[]
                          (local_10,local_3c0);
      local_548 = (undefined8)*pvVar56;
      local_540 = *(undefined8 *)((long)pvVar56 + 8);
      kmer_03[7] = in_stack_fffffffffffff007;
      kmer_03._0_7_ = in_stack_fffffffffffff000;
      kmer_03._8_7_ = in_stack_fffffffffffff008;
      kmer_03[0xf] = in_stack_fffffffffffff00f;
      kmer_fw_neighbours128((__uint128_t)kmer_03,(uint8_t)(in_stack_ffffffffffffeffc >> 0x18));
      pvVar57 = std::array<unsigned___int128,_4UL>::operator[]
                          ((array<unsigned___int128,_4UL> *)in_stack_ffffffffffffefd0,
                           CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
      local_568 = (undefined8)*pvVar57;
      local_560 = *(undefined8 *)((long)pvVar57 + 8);
      kmer_17[7] = in_stack_fffffffffffff017;
      kmer_17._0_7_ = in_stack_fffffffffffff010;
      kmer_17._8_4_ = in_stack_fffffffffffff018;
      kmer_17._12_4_ = in_stack_fffffffffffff01c;
      local_4f8 = local_568;
      uStack_4f0 = local_560;
      local_578 = kmer_cannonical128((__uint128_t)kmer_17,in_stack_fffffffffffff00f);
      local_558 = local_578;
      uStack_550 = extraout_RDX_00;
      local_590 = (unsigned___int128 *)
                  std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::begin
                            ((vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
                             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
      local_598 = (unsigned___int128 *)
                  std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::end
                            ((vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
                             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
      __first_02._M_current._4_4_ = in_stack_ffffffffffffeffc;
      __first_02._M_current._0_4_ = in_stack_ffffffffffffeff8;
      __last_00._M_current._4_4_ = in_stack_ffffffffffffeff4;
      __last_00._M_current._0_4_ = in_stack_ffffffffffffeff0;
      local_588 = (unsigned___int128 *)
                  std::
                  lower_bound<__gnu_cxx::__normal_iterator<unsigned__int128_const*,std::vector<unsigned__int128,std::allocator<unsigned__int128>>>,unsigned__int128>
                            (__first_02,__last_00,(unsigned___int128 *)in_stack_ffffffffffffefe8);
      local_5a0 = (unsigned___int128 *)
                  std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::begin
                            ((vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
                             CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
      local_580 = __gnu_cxx::operator-
                            ((__normal_iterator<const_unsigned___int128_*,_std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>_>
                              *)in_stack_ffffffffffffefd0,
                             (__normal_iterator<const_unsigned___int128_*,_std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>_>
                              *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
      local_5a8 = std::vector<kcontext,_std::allocator<kcontext>_>::operator[](local_110,local_580);
      cVar67 = -(local_4f8._2_1_ == local_558._2_1_);
      cVar68 = -(local_4f8._3_1_ == local_558._3_1_);
      cVar69 = -(local_4f8._4_1_ == local_558._4_1_);
      cVar70 = -(local_4f8._5_1_ == local_558._5_1_);
      cVar71 = -(local_4f8._6_1_ == local_558._6_1_);
      cVar72 = -(local_4f8._7_1_ == local_558._7_1_);
      cVar73 = -((char)uStack_4f0 == (char)uStack_550);
      cVar74 = -(uStack_4f0._1_1_ == uStack_550._1_1_);
      cVar75 = -(uStack_4f0._2_1_ == uStack_550._2_1_);
      cVar76 = -(uStack_4f0._3_1_ == uStack_550._3_1_);
      cVar77 = -(uStack_4f0._4_1_ == uStack_550._4_1_);
      cVar78 = -(uStack_4f0._5_1_ == uStack_550._5_1_);
      cVar80 = -(uStack_4f0._6_1_ == uStack_550._6_1_);
      bVar82 = -(uStack_4f0._7_1_ == uStack_550._7_1_);
      auVar5[1] = -(local_4f8._1_1_ == local_558._1_1_);
      auVar5[0] = -((char)local_4f8 == (char)local_558);
      auVar5[2] = cVar67;
      auVar5[3] = cVar68;
      auVar5[4] = cVar69;
      auVar5[5] = cVar70;
      auVar5[6] = cVar71;
      auVar5[7] = cVar72;
      auVar5[8] = cVar73;
      auVar5[9] = cVar74;
      auVar5[10] = cVar75;
      auVar5[0xb] = cVar76;
      auVar5[0xc] = cVar77;
      auVar5[0xd] = cVar78;
      auVar5[0xe] = cVar80;
      auVar5[0xf] = bVar82;
      auVar6[1] = -(local_4f8._1_1_ == local_558._1_1_);
      auVar6[0] = -((char)local_4f8 == (char)local_558);
      auVar6[2] = cVar67;
      auVar6[3] = cVar68;
      auVar6[4] = cVar69;
      auVar6[5] = cVar70;
      auVar6[6] = cVar71;
      auVar6[7] = cVar72;
      auVar6[8] = cVar73;
      auVar6[9] = cVar74;
      auVar6[10] = cVar75;
      auVar6[0xb] = cVar76;
      auVar6[0xc] = cVar77;
      auVar6[0xd] = cVar78;
      auVar6[0xe] = cVar80;
      auVar6[0xf] = bVar82;
      auVar47[1] = cVar68;
      auVar47[0] = cVar67;
      auVar47[2] = cVar69;
      auVar47[3] = cVar70;
      auVar47[4] = cVar71;
      auVar47[5] = cVar72;
      auVar47[6] = cVar73;
      auVar47[7] = cVar74;
      auVar47[8] = cVar75;
      auVar47[9] = cVar76;
      auVar47[10] = cVar77;
      auVar47[0xb] = cVar78;
      auVar47[0xc] = cVar80;
      auVar47[0xd] = bVar82;
      auVar39[1] = cVar69;
      auVar39[0] = cVar68;
      auVar39[2] = cVar70;
      auVar39[3] = cVar71;
      auVar39[4] = cVar72;
      auVar39[5] = cVar73;
      auVar39[6] = cVar74;
      auVar39[7] = cVar75;
      auVar39[8] = cVar76;
      auVar39[9] = cVar77;
      auVar39[10] = cVar78;
      auVar39[0xb] = cVar80;
      auVar39[0xc] = bVar82;
      auVar31[1] = cVar70;
      auVar31[0] = cVar69;
      auVar31[2] = cVar71;
      auVar31[3] = cVar72;
      auVar31[4] = cVar73;
      auVar31[5] = cVar74;
      auVar31[6] = cVar75;
      auVar31[7] = cVar76;
      auVar31[8] = cVar77;
      auVar31[9] = cVar78;
      auVar31[10] = cVar80;
      auVar31[0xb] = bVar82;
      auVar23[1] = cVar71;
      auVar23[0] = cVar70;
      auVar23[2] = cVar72;
      auVar23[3] = cVar73;
      auVar23[4] = cVar74;
      auVar23[5] = cVar75;
      auVar23[6] = cVar76;
      auVar23[7] = cVar77;
      auVar23[8] = cVar78;
      auVar23[9] = cVar80;
      auVar23[10] = bVar82;
      if (((((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar47 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar39 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar31 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar23 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(bVar82,CONCAT18(cVar80,CONCAT17(cVar78,CONCAT16(
                                                  cVar77,CONCAT15(cVar76,CONCAT14(cVar75,CONCAT13(
                                                  cVar74,CONCAT12(cVar73,CONCAT11(cVar72,cVar71)))))
                                                  )))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(bVar82,CONCAT17(cVar80,CONCAT16(cVar78,CONCAT15(
                                                  cVar77,CONCAT14(cVar76,CONCAT13(cVar75,CONCAT12(
                                                  cVar74,CONCAT11(cVar73,cVar72)))))))) >> 7) & 1)
                      << 7 | (ushort)(bVar82 >> 7) << 0xf) == 0xffff) &&
           (*(byte *)local_5a8 >> 4 != 1)) && (*(byte *)local_5a8 >> 4 != 2)) &&
         ((*(byte *)local_5a8 >> 4 != 4 && (*(byte *)local_5a8 >> 4 != 8)))) {
        rVar83 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)
                            CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                            (size_type)in_stack_ffffffffffffefe8);
        local_5b8 = rVar83;
        std::_Bit_reference::operator=(&local_5b8,true);
      }
      cVar67 = -(local_4f8._2_1_ == local_558._2_1_);
      cVar68 = -(local_4f8._3_1_ == local_558._3_1_);
      cVar69 = -(local_4f8._4_1_ == local_558._4_1_);
      cVar70 = -(local_4f8._5_1_ == local_558._5_1_);
      cVar71 = -(local_4f8._6_1_ == local_558._6_1_);
      cVar72 = -(local_4f8._7_1_ == local_558._7_1_);
      cVar73 = -((char)uStack_4f0 == (char)uStack_550);
      cVar74 = -(uStack_4f0._1_1_ == uStack_550._1_1_);
      cVar75 = -(uStack_4f0._2_1_ == uStack_550._2_1_);
      cVar76 = -(uStack_4f0._3_1_ == uStack_550._3_1_);
      cVar77 = -(uStack_4f0._4_1_ == uStack_550._4_1_);
      cVar78 = -(uStack_4f0._5_1_ == uStack_550._5_1_);
      cVar80 = -(uStack_4f0._6_1_ == uStack_550._6_1_);
      bVar82 = -(uStack_4f0._7_1_ == uStack_550._7_1_);
      auVar7[1] = -(local_4f8._1_1_ == local_558._1_1_);
      auVar7[0] = -((char)local_4f8 == (char)local_558);
      auVar7[2] = cVar67;
      auVar7[3] = cVar68;
      auVar7[4] = cVar69;
      auVar7[5] = cVar70;
      auVar7[6] = cVar71;
      auVar7[7] = cVar72;
      auVar7[8] = cVar73;
      auVar7[9] = cVar74;
      auVar7[10] = cVar75;
      auVar7[0xb] = cVar76;
      auVar7[0xc] = cVar77;
      auVar7[0xd] = cVar78;
      auVar7[0xe] = cVar80;
      auVar7[0xf] = bVar82;
      auVar8[1] = -(local_4f8._1_1_ == local_558._1_1_);
      auVar8[0] = -((char)local_4f8 == (char)local_558);
      auVar8[2] = cVar67;
      auVar8[3] = cVar68;
      auVar8[4] = cVar69;
      auVar8[5] = cVar70;
      auVar8[6] = cVar71;
      auVar8[7] = cVar72;
      auVar8[8] = cVar73;
      auVar8[9] = cVar74;
      auVar8[10] = cVar75;
      auVar8[0xb] = cVar76;
      auVar8[0xc] = cVar77;
      auVar8[0xd] = cVar78;
      auVar8[0xe] = cVar80;
      auVar8[0xf] = bVar82;
      auVar48[1] = cVar68;
      auVar48[0] = cVar67;
      auVar48[2] = cVar69;
      auVar48[3] = cVar70;
      auVar48[4] = cVar71;
      auVar48[5] = cVar72;
      auVar48[6] = cVar73;
      auVar48[7] = cVar74;
      auVar48[8] = cVar75;
      auVar48[9] = cVar76;
      auVar48[10] = cVar77;
      auVar48[0xb] = cVar78;
      auVar48[0xc] = cVar80;
      auVar48[0xd] = bVar82;
      auVar40[1] = cVar69;
      auVar40[0] = cVar68;
      auVar40[2] = cVar70;
      auVar40[3] = cVar71;
      auVar40[4] = cVar72;
      auVar40[5] = cVar73;
      auVar40[6] = cVar74;
      auVar40[7] = cVar75;
      auVar40[8] = cVar76;
      auVar40[9] = cVar77;
      auVar40[10] = cVar78;
      auVar40[0xb] = cVar80;
      auVar40[0xc] = bVar82;
      auVar32[1] = cVar70;
      auVar32[0] = cVar69;
      auVar32[2] = cVar71;
      auVar32[3] = cVar72;
      auVar32[4] = cVar73;
      auVar32[5] = cVar74;
      auVar32[6] = cVar75;
      auVar32[7] = cVar76;
      auVar32[8] = cVar77;
      auVar32[9] = cVar78;
      auVar32[10] = cVar80;
      auVar32[0xb] = bVar82;
      auVar24[1] = cVar71;
      auVar24[0] = cVar70;
      auVar24[2] = cVar72;
      auVar24[3] = cVar73;
      auVar24[4] = cVar74;
      auVar24[5] = cVar75;
      auVar24[6] = cVar76;
      auVar24[7] = cVar77;
      auVar24[8] = cVar78;
      auVar24[9] = cVar80;
      auVar24[10] = bVar82;
      if ((((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB141(auVar48 >> 7,0) & 1) << 2 |
                     (ushort)(SUB131(auVar40 >> 7,0) & 1) << 3 |
                     (ushort)(SUB121(auVar32 >> 7,0) & 1) << 4 |
                     (ushort)(SUB111(auVar24 >> 7,0) & 1) << 5 |
                     (ushort)((byte)(CONCAT19(bVar82,CONCAT18(cVar80,CONCAT17(cVar78,CONCAT16(cVar77
                                                  ,CONCAT15(cVar76,CONCAT14(cVar75,CONCAT13(cVar74,
                                                  CONCAT12(cVar73,CONCAT11(cVar72,cVar71))))))))) >>
                                    7) & 1) << 6 |
                     (ushort)((byte)(CONCAT18(bVar82,CONCAT17(cVar80,CONCAT16(cVar78,CONCAT15(cVar77
                                                  ,CONCAT14(cVar76,CONCAT13(cVar75,CONCAT12(cVar74,
                                                  CONCAT11(cVar73,cVar72)))))))) >> 7) & 1) << 7 |
                    (ushort)(bVar82 >> 7) << 0xf) != 0xffff) && (((uint)*local_5a8 & 0xf) != 1)) &&
         ((((uint)*local_5a8 & 0xf) != 2 &&
          ((((uint)*local_5a8 & 0xf) != 4 && (((uint)*local_5a8 & 0xf) != 8)))))) {
        rVar83 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)
                            CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                            (size_type)in_stack_ffffffffffffefe8);
        local_5c8 = rVar83;
        std::_Bit_reference::operator=(&local_5c8,true);
      }
    }
    else {
      rVar83 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)
                          CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                          (size_type)in_stack_ffffffffffffefe8);
      local_4d8 = rVar83;
      std::_Bit_reference::operator=(&local_4d8,true);
    }
    local_3c0 = local_3c0 + 1;
  }
  poVar54 = sdglib::OutputLog(in_stack_ffffffffffffeffc,
                              SUB41((uint)in_stack_ffffffffffffeff8 >> 0x18,0));
  poVar54 = std::operator<<(poVar54,"Creating unitigs");
  std::ostream::operator<<(poVar54,std::endl<char,std::char_traits<char>>);
  local_5d0 = 0;
  do {
    uVar3 = local_5d0;
    sVar55 = std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::size(local_10);
    if (sVar55 <= uVar3) {
      poVar54 = sdglib::OutputLog(in_stack_ffffffffffffeffc,
                                  SUB41((uint)in_stack_ffffffffffffeff8 >> 0x18,0));
      sVar55 = std::vector<Node,_std::allocator<Node>_>::size
                         ((vector<Node,_std::allocator<Node>_> *)(*in_RDI + 0x40));
      poVar60 = (ostream *)std::ostream::operator<<(poVar54,sVar55);
      kmerlist_00 = std::operator<<(poVar60," unitigs");
      std::ostream::operator<<(kmerlist_00,std::endl<char,std::char_traits<char>>);
      poVar61 = sdglib::OutputLog(in_stack_ffffffffffffeffc,
                                  SUB41((uint)in_stack_ffffffffffffeff8 >> 0x18,0));
      poVar61 = std::operator<<(poVar61,"doing the circles now");
      std::ostream::operator<<(poVar61,std::endl<char,std::char_traits<char>>);
      local_848 = 0;
      while( true ) {
        uVar3 = local_848;
        sVar55 = std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::size(local_10);
        if (sVar55 <= uVar3) break;
        rVar83 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)
                            CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                            (size_type)in_stack_ffffffffffffefe8);
        local_858 = rVar83;
        bVar53 = std::_Bit_reference::operator_cast_to_bool(&local_858);
        if (!bVar53) {
          pvVar56 = std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::operator[]
                              (local_10,local_848);
          local_868 = (undefined8)*pvVar56;
          uStack_860 = *(undefined8 *)((long)pvVar56 + 8);
          std::vector<klidxs128,_std::allocator<klidxs128>_>::vector
                    ((vector<klidxs128,_std::allocator<klidxs128>_> *)0x458740);
          local_884 = 0x54474341;
          uStack_890 = uStack_860;
          local_898 = local_868;
          rVar83 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)
                              CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                              (size_type)in_stack_ffffffffffffefe8);
          local_8a8 = rVar83;
          std::_Bit_reference::operator=(&local_8a8,true);
          local_8d0 = uStack_890;
          local_8d8 = local_898;
          kmer_07[7] = in_stack_fffffffffffff007;
          kmer_07._0_7_ = in_stack_fffffffffffff000;
          kmer_07._8_7_ = in_stack_fffffffffffff008;
          kmer_07[0xf] = in_stack_fffffffffffff00f;
          kmer_to_sequence128_abi_cxx11_
                    ((__uint128_t)kmer_07,(uint8_t)(in_stack_ffffffffffffeffc >> 0x18));
          std::__cxx11::string::operator=(local_c8,local_8c8);
          std::__cxx11::string::~string(local_8c8);
          while( true ) {
            local_8e0 = uStack_890;
            local_8e8 = local_898;
            kmer_20._8_7_ = in_stack_fffffffffffff0c8;
            kmer_20._0_8_ = poVar54;
            kmer_20[0xf] = in_stack_fffffffffffff0cf;
            get_fw_idxs128(in_stack_fffffffffffff0d8,(__uint128_t)kmer_20,
                           (uint8_t)((ulong)poVar60 >> 0x38),
                           (vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
                           kmerlist_00);
            pvVar62 = std::vector<klidxs128,_std::allocator<klidxs128>_>::operator[](&local_880,0);
            uVar1 = (undefined8)pvVar62->kmer;
            uVar2 = *(undefined8 *)((long)&pvVar62->kmer + 8);
            local_898._0_1_ = (char)uVar1;
            local_898._1_1_ = (char)((ulong)uVar1 >> 8);
            local_898._2_1_ = (char)((ulong)uVar1 >> 0x10);
            local_898._3_1_ = (char)((ulong)uVar1 >> 0x18);
            local_898._4_1_ = (char)((ulong)uVar1 >> 0x20);
            local_898._5_1_ = (char)((ulong)uVar1 >> 0x28);
            local_898._6_1_ = (char)((ulong)uVar1 >> 0x30);
            local_898._7_1_ = (char)((ulong)uVar1 >> 0x38);
            uStack_890._0_1_ = (char)uVar2;
            uStack_890._1_1_ = (char)((ulong)uVar2 >> 8);
            uStack_890._2_1_ = (char)((ulong)uVar2 >> 0x10);
            uStack_890._3_1_ = (char)((ulong)uVar2 >> 0x18);
            uStack_890._4_1_ = (char)((ulong)uVar2 >> 0x20);
            uStack_890._5_1_ = (char)((ulong)uVar2 >> 0x28);
            uStack_890._6_1_ = (char)((ulong)uVar2 >> 0x30);
            uStack_890._7_1_ = (char)((ulong)uVar2 >> 0x38);
            cVar67 = -(local_898._2_1_ == local_868._2_1_);
            cVar68 = -(local_898._3_1_ == local_868._3_1_);
            cVar69 = -(local_898._4_1_ == local_868._4_1_);
            cVar70 = -(local_898._5_1_ == local_868._5_1_);
            cVar71 = -(local_898._6_1_ == local_868._6_1_);
            cVar72 = -(local_898._7_1_ == local_868._7_1_);
            cVar73 = -((char)uStack_890 == (char)uStack_860);
            cVar74 = -(uStack_890._1_1_ == uStack_860._1_1_);
            cVar75 = -(uStack_890._2_1_ == uStack_860._2_1_);
            cVar76 = -(uStack_890._3_1_ == uStack_860._3_1_);
            cVar77 = -(uStack_890._4_1_ == uStack_860._4_1_);
            cVar78 = -(uStack_890._5_1_ == uStack_860._5_1_);
            cVar80 = -(uStack_890._6_1_ == uStack_860._6_1_);
            bVar82 = -(uStack_890._7_1_ == uStack_860._7_1_);
            auVar17[1] = -(local_898._1_1_ == local_868._1_1_);
            auVar17[0] = -((char)local_898 == (char)local_868);
            auVar17[2] = cVar67;
            auVar17[3] = cVar68;
            auVar17[4] = cVar69;
            auVar17[5] = cVar70;
            auVar17[6] = cVar71;
            auVar17[7] = cVar72;
            auVar17[8] = cVar73;
            auVar17[9] = cVar74;
            auVar17[10] = cVar75;
            auVar17[0xb] = cVar76;
            auVar17[0xc] = cVar77;
            auVar17[0xd] = cVar78;
            auVar17[0xe] = cVar80;
            auVar17[0xf] = bVar82;
            auVar18[1] = -(local_898._1_1_ == local_868._1_1_);
            auVar18[0] = -((char)local_898 == (char)local_868);
            auVar18[2] = cVar67;
            auVar18[3] = cVar68;
            auVar18[4] = cVar69;
            auVar18[5] = cVar70;
            auVar18[6] = cVar71;
            auVar18[7] = cVar72;
            auVar18[8] = cVar73;
            auVar18[9] = cVar74;
            auVar18[10] = cVar75;
            auVar18[0xb] = cVar76;
            auVar18[0xc] = cVar77;
            auVar18[0xd] = cVar78;
            auVar18[0xe] = cVar80;
            auVar18[0xf] = bVar82;
            auVar51[1] = cVar68;
            auVar51[0] = cVar67;
            auVar51[2] = cVar69;
            auVar51[3] = cVar70;
            auVar51[4] = cVar71;
            auVar51[5] = cVar72;
            auVar51[6] = cVar73;
            auVar51[7] = cVar74;
            auVar51[8] = cVar75;
            auVar51[9] = cVar76;
            auVar51[10] = cVar77;
            auVar51[0xb] = cVar78;
            auVar51[0xc] = cVar80;
            auVar51[0xd] = bVar82;
            auVar43[1] = cVar69;
            auVar43[0] = cVar68;
            auVar43[2] = cVar70;
            auVar43[3] = cVar71;
            auVar43[4] = cVar72;
            auVar43[5] = cVar73;
            auVar43[6] = cVar74;
            auVar43[7] = cVar75;
            auVar43[8] = cVar76;
            auVar43[9] = cVar77;
            auVar43[10] = cVar78;
            auVar43[0xb] = cVar80;
            auVar43[0xc] = bVar82;
            auVar35[1] = cVar70;
            auVar35[0] = cVar69;
            auVar35[2] = cVar71;
            auVar35[3] = cVar72;
            auVar35[4] = cVar73;
            auVar35[5] = cVar74;
            auVar35[6] = cVar75;
            auVar35[7] = cVar76;
            auVar35[8] = cVar77;
            auVar35[9] = cVar78;
            auVar35[10] = cVar80;
            auVar35[0xb] = bVar82;
            auVar27[1] = cVar71;
            auVar27[0] = cVar70;
            auVar27[2] = cVar72;
            auVar27[3] = cVar73;
            auVar27[4] = cVar74;
            auVar27[5] = cVar75;
            auVar27[6] = cVar76;
            auVar27[7] = cVar77;
            auVar27[8] = cVar78;
            auVar27[9] = cVar80;
            auVar27[10] = bVar82;
            local_898 = uVar1;
            uStack_890 = uVar2;
            if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB141(auVar51 >> 7,0) & 1) << 2 |
                         (ushort)(SUB131(auVar43 >> 7,0) & 1) << 3 |
                         (ushort)(SUB121(auVar35 >> 7,0) & 1) << 4 |
                         (ushort)(SUB111(auVar27 >> 7,0) & 1) << 5 |
                         (ushort)((byte)(CONCAT19(bVar82,CONCAT18(cVar80,CONCAT17(cVar78,CONCAT16(
                                                  cVar77,CONCAT15(cVar76,CONCAT14(cVar75,CONCAT13(
                                                  cVar74,CONCAT12(cVar73,CONCAT11(cVar72,cVar71)))))
                                                  )))) >> 7) & 1) << 6 |
                         (ushort)((byte)(CONCAT18(bVar82,CONCAT17(cVar80,CONCAT16(cVar78,CONCAT15(
                                                  cVar77,CONCAT14(cVar76,CONCAT13(cVar75,CONCAT12(
                                                  cVar74,CONCAT11(cVar73,cVar72)))))))) >> 7) & 1)
                         << 7 | (ushort)(bVar82 >> 7) << 0xf) == 0xffff) break;
            std::vector<klidxs128,_std::allocator<klidxs128>_>::operator[](&local_880,0);
            rVar83 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)
                                CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                                (size_type)in_stack_ffffffffffffefe8);
            local_8f8 = rVar83;
            std::_Bit_reference::operator=(&local_8f8,true);
            std::__cxx11::string::push_back((char)local_c8);
          }
          Node::Node((Node *)CONCAT17(in_stack_ffffffffffffefe7,in_stack_ffffffffffffefe0),
                     (string *)in_stack_ffffffffffffefd8._M_current);
          SequenceDistanceGraph::add_node
                    (in_stack_ffffffffffffefd0,
                     (Node *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
          Node::~Node((Node *)0x4589c3);
          std::vector<Node,_std::allocator<Node>_>::back
                    ((vector<Node,_std::allocator<Node>_> *)in_stack_ffffffffffffefd0);
          bVar53 = Node::is_canonical(in_stack_ffffffffffffefe8);
          if (!bVar53) {
            std::vector<Node,_std::allocator<Node>_>::back
                      ((vector<Node,_std::allocator<Node>_> *)in_stack_ffffffffffffefd0);
            Node::make_rc(in_stack_fffffffffffff050);
          }
          std::vector<klidxs128,_std::allocator<klidxs128>_>::~vector
                    ((vector<klidxs128,_std::allocator<klidxs128>_> *)
                     CONCAT17(in_stack_ffffffffffffefe7,in_stack_ffffffffffffefe0));
        }
        local_848 = local_848 + 1;
      }
      poVar54 = sdglib::OutputLog(in_stack_ffffffffffffeffc,
                                  SUB41((uint)in_stack_ffffffffffffeff8 >> 0x18,0));
      sVar55 = std::vector<Node,_std::allocator<Node>_>::size
                         ((vector<Node,_std::allocator<Node>_> *)(*in_RDI + 0x40));
      poVar54 = (ostream *)std::ostream::operator<<(poVar54,sVar55);
      poVar54 = std::operator<<(poVar54," unitigs");
      std::ostream::operator<<(poVar54,std::endl<char,std::char_traits<char>>);
      puVar87 = local_948;
      std::
      vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ::vector((vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                *)0x458af4);
      std::
      vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ::vector((vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                *)0x458b01);
      std::vector<Node,_std::allocator<Node>_>::size
                ((vector<Node,_std::allocator<Node>_> *)(*in_RDI + 0x40));
      std::
      vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ::reserve((vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                 *)CONCAT17(in_stack_fffffffffffff007,in_stack_fffffffffffff000),
                CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8));
      std::vector<Node,_std::allocator<Node>_>::size
                ((vector<Node,_std::allocator<Node>_> *)(*in_RDI + 0x40));
      std::
      vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ::reserve((vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                 *)CONCAT17(in_stack_fffffffffffff007,in_stack_fffffffffffff000),
                CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8));
      CStringKMerFactory128::CStringKMerFactory128
                ((CStringKMerFactory128 *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefcf);
      local_bc0 = (DistanceGraph *)0x1;
      while( true ) {
        this_00 = local_bc0;
        pDVar63 = (DistanceGraph *)
                  std::vector<Node,_std::allocator<Node>_>::size
                            ((vector<Node,_std::allocator<Node>_> *)(*in_RDI + 0x40));
        if (pDVar63 <= this_00) break;
        std::
        vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
        ::vector((vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                  *)0x458bb7);
        std::
        vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
        ::vector((vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                  *)0x458bc4);
        pvVar64 = std::vector<Node,_std::allocator<Node>_>::operator[]
                            ((vector<Node,_std::allocator<Node>_> *)(*in_RDI + 0x40),
                             (size_type)local_bc0);
        std::__cxx11::string::substr((ulong)local_c10,(ulong)pvVar64);
        std::__cxx11::string::c_str();
        CStringKMerFactory128::create_kmers_direction
                  ((CStringKMerFactory128 *)
                   CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                   (vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                    *)in_stack_ffffffffffffefe8,
                   (char *)CONCAT17(in_stack_ffffffffffffefe7,in_stack_ffffffffffffefe0));
        std::__cxx11::string::~string(local_c10);
        pvVar65 = std::
                  vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                  ::operator[](&local_bd8,0);
        if ((pvVar65->second & 1U) == 0) {
          std::
          vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
          ::operator[](&local_bd8,0);
          std::
          vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>
          ::emplace_back<unsigned__int128&,unsigned_long&>
                    ((vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                      *)CONCAT17(in_stack_ffffffffffffefe7,in_stack_ffffffffffffefe0),
                     &(in_stack_ffffffffffffefd8._M_current)->first,
                     (unsigned_long *)in_stack_ffffffffffffefd0);
        }
        else {
          std::
          vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
          ::operator[](&local_bd8,0);
          std::
          vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>
          ::emplace_back<unsigned__int128&,unsigned_long&>
                    ((vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                      *)CONCAT17(in_stack_ffffffffffffefe7,in_stack_ffffffffffffefe0),
                     &(in_stack_ffffffffffffefd8._M_current)->first,
                     (unsigned_long *)in_stack_ffffffffffffefd0);
        }
        in_stack_fffffffffffff028 =
             std::vector<Node,_std::allocator<Node>_>::operator[]
                       ((vector<Node,_std::allocator<Node>_> *)(*in_RDI + 0x40),(size_type)local_bc0
                       );
        std::vector<Node,_std::allocator<Node>_>::operator[]
                  ((vector<Node,_std::allocator<Node>_> *)(*in_RDI + 0x40),(size_type)local_bc0);
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_c30,(ulong)in_stack_fffffffffffff028);
        std::__cxx11::string::c_str();
        CStringKMerFactory128::create_kmers_direction
                  ((CStringKMerFactory128 *)
                   CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                   (vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                    *)in_stack_ffffffffffffefe8,
                   (char *)CONCAT17(in_stack_ffffffffffffefe7,in_stack_ffffffffffffefe0));
        std::__cxx11::string::~string(local_c30);
        pvVar65 = std::
                  vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                  ::operator[](&local_bf0,0);
        if ((pvVar65->second & 1U) == 0) {
          std::
          vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
          ::operator[](&local_bf0,0);
          local_c40 = -(long)local_bc0;
          std::
          vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>
          ::emplace_back<unsigned__int128&,unsigned_long>
                    ((vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                      *)CONCAT17(in_stack_ffffffffffffefe7,in_stack_ffffffffffffefe0),
                     &(in_stack_ffffffffffffefd8._M_current)->first,
                     (unsigned_long *)in_stack_ffffffffffffefd0);
        }
        else {
          std::
          vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
          ::operator[](&local_bf0,0);
          local_c38 = -(long)local_bc0;
          std::
          vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>
          ::emplace_back<unsigned__int128&,unsigned_long>
                    ((vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                      *)CONCAT17(in_stack_ffffffffffffefe7,in_stack_ffffffffffffefe0),
                     &(in_stack_ffffffffffffefd8._M_current)->first,
                     (unsigned_long *)in_stack_ffffffffffffefd0);
        }
        std::
        vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
        ::~vector((vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                   *)CONCAT17(in_stack_ffffffffffffefe7,in_stack_ffffffffffffefe0));
        std::
        vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
        ::~vector((vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                   *)CONCAT17(in_stack_ffffffffffffefe7,in_stack_ffffffffffffefe0));
        local_bc0 = (DistanceGraph *)((long)&local_bc0->sdg + 1);
      }
      dest = local_948;
      local_c48 = (pair<unsigned___int128,_long> *)
                  std::
                  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                  ::begin((vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                           *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
      local_c50 = (pair<unsigned___int128,_long> *)
                  std::
                  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                  ::end((vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                         *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
      __first._M_current._7_1_ = in_stack_ffffffffffffefe7;
      __first._M_current._0_7_ = in_stack_ffffffffffffefe0;
      std::
      sort<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,long>*,std::vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>>>
                (__first,in_stack_ffffffffffffefd8);
      pvVar86 = &local_960;
      local_c58 = (pair<unsigned___int128,_long> *)
                  std::
                  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                  ::begin((vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                           *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
      local_c60 = (pair<unsigned___int128,_long> *)
                  std::
                  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                  ::end((vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                         *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
      __first_00._M_current._7_1_ = in_stack_ffffffffffffefe7;
      __first_00._M_current._0_7_ = in_stack_ffffffffffffefe0;
      std::
      sort<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,long>*,std::vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>>>
                (__first_00,in_stack_ffffffffffffefd8);
      local_c68 = 0;
      local_c70 = local_948;
      local_c78._M_current =
           (pair<unsigned___int128,_long> *)
           std::
           vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
           ::begin((vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                    *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
      local_c80 = (pair<unsigned___int128,_long> *)
                  std::
                  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                  ::end((vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                         *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
      while( true ) {
        uVar85 = (undefined1)((uint)in_stack_ffffffffffffeff8 >> 0x18);
        bVar53 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<unsigned___int128,_long>_*,_std::vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>_>
                             *)in_stack_ffffffffffffefd0,
                            (__normal_iterator<std::pair<unsigned___int128,_long>_*,_std::vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>_>
                             *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
        if (!bVar53) break;
        local_c88 = __gnu_cxx::
                    __normal_iterator<std::pair<unsigned___int128,_long>_*,_std::vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>_>
                    ::operator*(&local_c78);
        while( true ) {
          uVar84 = (undefined7)local_c68;
          uVar85 = (undefined1)(local_c68 >> 0x38);
          sVar55 = std::
                   vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                   ::size(&local_960);
          bVar53 = false;
          if (CONCAT17(uVar85,uVar84) < sVar55) {
            pvVar66 = std::
                      vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                      ::operator[](&local_960,local_c68);
            uVar3 = *(ulong *)((long)&pvVar66->first + 8);
            uVar4 = *(ulong *)((long)&local_c88->first + 8);
            bVar53 = uVar3 < uVar4 ||
                     uVar3 - uVar4 < (ulong)((ulong)pvVar66->first < (ulong)local_c88->first);
          }
          if (!bVar53) break;
          local_c68 = local_c68 + 1;
        }
        local_c90 = local_c68;
        while( true ) {
          in_stack_ffffffffffffeff8 = (undefined4)local_c90;
          in_stack_ffffffffffffeffc = (LogLevels)(local_c90 >> 0x20);
          sVar55 = std::
                   vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                   ::size(&local_960);
          bVar53 = false;
          if (CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8) < sVar55) {
            pvVar66 = std::
                      vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                      ::operator[](&local_960,local_c90);
            cVar67 = -((char)pvVar66->first == (char)local_c88->first);
            cVar68 = -(*(char *)((long)&pvVar66->first + 1) ==
                      *(char *)((long)&local_c88->first + 1));
            cVar69 = -(*(char *)((long)&pvVar66->first + 2) ==
                      *(char *)((long)&local_c88->first + 2));
            cVar70 = -(*(char *)((long)&pvVar66->first + 3) ==
                      *(char *)((long)&local_c88->first + 3));
            cVar71 = -(*(char *)((long)&pvVar66->first + 4) ==
                      *(char *)((long)&local_c88->first + 4));
            cVar72 = -(*(char *)((long)&pvVar66->first + 5) ==
                      *(char *)((long)&local_c88->first + 5));
            cVar73 = -(*(char *)((long)&pvVar66->first + 6) ==
                      *(char *)((long)&local_c88->first + 6));
            cVar74 = -(*(char *)((long)&pvVar66->first + 7) ==
                      *(char *)((long)&local_c88->first + 7));
            cVar75 = -(*(char *)((long)&pvVar66->first + 8) ==
                      *(char *)((long)&local_c88->first + 8));
            cVar76 = -(*(char *)((long)&pvVar66->first + 9) ==
                      *(char *)((long)&local_c88->first + 9));
            cVar77 = -(*(char *)((long)&pvVar66->first + 10) ==
                      *(char *)((long)&local_c88->first + 10));
            cVar78 = -(*(char *)((long)&pvVar66->first + 0xb) ==
                      *(char *)((long)&local_c88->first + 0xb));
            cVar80 = -(*(char *)((long)&pvVar66->first + 0xc) ==
                      *(char *)((long)&local_c88->first + 0xc));
            cVar79 = -(*(char *)((long)&pvVar66->first + 0xd) ==
                      *(char *)((long)&local_c88->first + 0xd));
            cVar81 = -(*(char *)((long)&pvVar66->first + 0xe) ==
                      *(char *)((long)&local_c88->first + 0xe));
            bVar82 = -(*(char *)((long)&pvVar66->first + 0xf) ==
                      *(char *)((long)&local_c88->first + 0xf));
            auVar19[1] = cVar68;
            auVar19[0] = cVar67;
            auVar19[2] = cVar69;
            auVar19[3] = cVar70;
            auVar19[4] = cVar71;
            auVar19[5] = cVar72;
            auVar19[6] = cVar73;
            auVar19[7] = cVar74;
            auVar19[8] = cVar75;
            auVar19[9] = cVar76;
            auVar19[10] = cVar77;
            auVar19[0xb] = cVar78;
            auVar19[0xc] = cVar80;
            auVar19[0xd] = cVar79;
            auVar19[0xe] = cVar81;
            auVar19[0xf] = bVar82;
            auVar20[1] = cVar68;
            auVar20[0] = cVar67;
            auVar20[2] = cVar69;
            auVar20[3] = cVar70;
            auVar20[4] = cVar71;
            auVar20[5] = cVar72;
            auVar20[6] = cVar73;
            auVar20[7] = cVar74;
            auVar20[8] = cVar75;
            auVar20[9] = cVar76;
            auVar20[10] = cVar77;
            auVar20[0xb] = cVar78;
            auVar20[0xc] = cVar80;
            auVar20[0xd] = cVar79;
            auVar20[0xe] = cVar81;
            auVar20[0xf] = bVar82;
            auVar52[1] = cVar70;
            auVar52[0] = cVar69;
            auVar52[2] = cVar71;
            auVar52[3] = cVar72;
            auVar52[4] = cVar73;
            auVar52[5] = cVar74;
            auVar52[6] = cVar75;
            auVar52[7] = cVar76;
            auVar52[8] = cVar77;
            auVar52[9] = cVar78;
            auVar52[10] = cVar80;
            auVar52[0xb] = cVar79;
            auVar52[0xc] = cVar81;
            auVar52[0xd] = bVar82;
            auVar44[1] = cVar71;
            auVar44[0] = cVar70;
            auVar44[2] = cVar72;
            auVar44[3] = cVar73;
            auVar44[4] = cVar74;
            auVar44[5] = cVar75;
            auVar44[6] = cVar76;
            auVar44[7] = cVar77;
            auVar44[8] = cVar78;
            auVar44[9] = cVar80;
            auVar44[10] = cVar79;
            auVar44[0xb] = cVar81;
            auVar44[0xc] = bVar82;
            auVar36[1] = cVar72;
            auVar36[0] = cVar71;
            auVar36[2] = cVar73;
            auVar36[3] = cVar74;
            auVar36[4] = cVar75;
            auVar36[5] = cVar76;
            auVar36[6] = cVar77;
            auVar36[7] = cVar78;
            auVar36[8] = cVar80;
            auVar36[9] = cVar79;
            auVar36[10] = cVar81;
            auVar36[0xb] = bVar82;
            auVar28[1] = cVar73;
            auVar28[0] = cVar72;
            auVar28[2] = cVar74;
            auVar28[3] = cVar75;
            auVar28[4] = cVar76;
            auVar28[5] = cVar77;
            auVar28[6] = cVar78;
            auVar28[7] = cVar80;
            auVar28[8] = cVar79;
            auVar28[9] = cVar81;
            auVar28[10] = bVar82;
            bVar53 = (ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB141(auVar52 >> 7,0) & 1) << 2 |
                              (ushort)(SUB131(auVar44 >> 7,0) & 1) << 3 |
                              (ushort)(SUB121(auVar36 >> 7,0) & 1) << 4 |
                              (ushort)(SUB111(auVar28 >> 7,0) & 1) << 5 |
                              (ushort)((byte)(CONCAT19(bVar82,CONCAT18(cVar81,CONCAT17(cVar79,
                                                  CONCAT16(cVar80,CONCAT15(cVar78,CONCAT14(cVar77,
                                                  CONCAT13(cVar76,CONCAT12(cVar75,CONCAT11(cVar74,
                                                  cVar73))))))))) >> 7) & 1) << 6 |
                              (ushort)((byte)(CONCAT18(bVar82,CONCAT17(cVar81,CONCAT16(cVar79,
                                                  CONCAT15(cVar80,CONCAT14(cVar78,CONCAT13(cVar77,
                                                  CONCAT12(cVar76,CONCAT11(cVar75,cVar74)))))))) >>
                                             7) & 1) << 7 | (ushort)(bVar82 >> 7) << 0xf) == 0xffff;
          }
          if (!bVar53) break;
          in_stack_ffffffffffffefe0 = (undefined7)local_c88->second;
          in_stack_ffffffffffffefe7 = (NodeStatus)((ulong)local_c88->second >> 0x38);
          std::
          vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
          ::operator[](&local_960,local_c90);
          Support::Support(&local_ca0,Undefined,0,0);
          support.id = (int64_t)poVar54;
          support._0_8_ = puVar87;
          DistanceGraph::add_link
                    (this_00,(sgNodeID_t)in_stack_fffffffffffff028,(sgNodeID_t)dest,
                     (int32_t)((ulong)pvVar86 >> 0x20),support);
          local_c90 = local_c90 + 1;
        }
        __gnu_cxx::
        __normal_iterator<std::pair<unsigned___int128,_long>_*,_std::vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>_>
        ::operator++(&local_c78);
      }
      poVar54 = sdglib::OutputLog(in_stack_ffffffffffffeffc,(bool)uVar85);
      poVar54 = std::operator<<(poVar54,"Graph construction finished");
      std::ostream::operator<<(poVar54,std::endl<char,std::char_traits<char>>);
      CStringKMerFactory128::~CStringKMerFactory128(&local_bb8);
      std::
      vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ::~vector((vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                 *)CONCAT17(in_stack_ffffffffffffefe7,in_stack_ffffffffffffefe0));
      std::
      vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ::~vector((vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                 *)CONCAT17(in_stack_ffffffffffffefe7,in_stack_ffffffffffffefe0));
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x45920a);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x459217);
      std::vector<kcontext,_std::allocator<kcontext>_>::~vector
                ((vector<kcontext,_std::allocator<kcontext>_> *)
                 CONCAT17(in_stack_ffffffffffffefe7,in_stack_ffffffffffffefe0));
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x459231);
      std::__cxx11::string::~string(local_c8);
      return;
    }
    rVar83 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                        (size_type)in_stack_ffffffffffffefe8);
    local_5e0 = rVar83;
    bVar53 = std::_Bit_reference::operator_cast_to_bool(&local_5e0);
    if (!bVar53) {
      pvVar56 = std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::operator[]
                          (local_10,local_5d0);
      local_5f8 = *(__uint128_t **)pvVar56;
      local_5f0 = *(undefined8 *)((long)pvVar56 + 8);
      rVar83 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)
                          CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                          (size_type)in_stack_ffffffffffffefe8);
      local_608 = rVar83;
      rVar83 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)
                          CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                          (size_type)in_stack_ffffffffffffefe8);
      local_618 = rVar83;
      bVar53 = std::_Bit_reference::operator_cast_to_bool(&local_608);
      if (!bVar53) {
        bVar53 = std::_Bit_reference::operator_cast_to_bool(&local_618);
        if (!bVar53) goto LAB_0045858d;
      }
      bVar53 = std::_Bit_reference::operator_cast_to_bool(&local_608);
      if (bVar53) {
        bVar53 = std::_Bit_reference::operator_cast_to_bool(&local_618);
        if (!bVar53) goto LAB_00457ded;
        local_640 = local_5f0;
        local_648 = local_5f8;
        kmer_04[7] = in_stack_fffffffffffff007;
        kmer_04._0_7_ = in_stack_fffffffffffff000;
        kmer_04._8_7_ = in_stack_fffffffffffff008;
        kmer_04[0xf] = in_stack_fffffffffffff00f;
        kmer_to_sequence128_abi_cxx11_
                  ((__uint128_t)kmer_04,(uint8_t)(in_stack_ffffffffffffeffc >> 0x18));
        std::__cxx11::string::operator=(local_c8,local_638);
        std::__cxx11::string::~string(local_638);
        rVar83 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)
                            CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                            (size_type)in_stack_ffffffffffffefe8);
        local_658 = rVar83;
        std::_Bit_reference::operator=(&local_658,true);
      }
      else {
LAB_00457ded:
        uStack_660 = local_5f0;
        local_668 = local_5f8;
        local_670 = local_5d0;
        rVar83 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)
                            CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                            (size_type)in_stack_ffffffffffffefe8);
        local_680 = rVar83;
        std::_Bit_reference::operator=(&local_680,true);
        bVar53 = std::_Bit_reference::operator_cast_to_bool(&local_618);
        if (bVar53) {
          local_690 = local_5f0;
          local_698 = local_5f8;
          kmer[7] = in_stack_ffffffffffffefcf;
          kmer._0_7_ = in_stack_ffffffffffffefc8;
          kmer._8_8_ = in_stack_ffffffffffffefd0;
          local_6a8 = kmer_reverse128(local_5f8,(__uint128_t)kmer,(uint8_t)local_5f0);
          __x._M_mask._0_7_ = in_stack_ffffffffffffefe0;
          __x._M_p = (_Bit_type *)in_stack_ffffffffffffefd8._M_current;
          __x._M_mask._7_1_ = in_stack_ffffffffffffefe7;
          __y._M_p._7_1_ = in_stack_ffffffffffffefcf;
          __y._M_p._0_7_ = in_stack_ffffffffffffefc8;
          __y._M_mask = (_Bit_type)in_stack_ffffffffffffefd0;
          local_668 = local_6a8;
          uStack_660 = extraout_RDX_01;
          local_6b8 = local_618;
          local_6c8 = local_608;
          std::swap(__x,__y);
        }
        local_6f0 = uStack_660;
        local_6f8 = local_668;
        kmer_05[7] = in_stack_fffffffffffff007;
        kmer_05._0_7_ = in_stack_fffffffffffff000;
        kmer_05._8_7_ = in_stack_fffffffffffff008;
        kmer_05[0xf] = in_stack_fffffffffffff00f;
        kmer_to_sequence128_abi_cxx11_
                  ((__uint128_t)kmer_05,(uint8_t)(in_stack_ffffffffffffeffc >> 0x18));
        std::__cxx11::string::operator=(local_c8,local_6e8);
        std::__cxx11::string::~string(local_6e8);
        local_6fc = 0x54474341;
        while( true ) {
          bVar53 = std::_Bit_reference::operator_cast_to_bool(&local_618);
          if (((bVar53 ^ 0xffU) & 1) == 0) break;
          pvVar58 = std::vector<kcontext,_std::allocator<kcontext>_>::operator[]
                              (local_110,local_670);
          local_700 = *pvVar58;
          local_710 = uStack_660;
          local_718 = local_668;
          kmer_18[7] = in_stack_fffffffffffff017;
          kmer_18._0_7_ = in_stack_fffffffffffff010;
          kmer_18._8_4_ = in_stack_fffffffffffff018;
          kmer_18._12_4_ = in_stack_fffffffffffff01c;
          p_Var59 = kmer_cannonical128((__uint128_t)kmer_18,in_stack_fffffffffffff00f);
          local_728._0_1_ = (char)p_Var59;
          local_728._1_1_ = (char)((ulong)p_Var59 >> 8);
          local_728._2_1_ = (char)((ulong)p_Var59 >> 0x10);
          local_728._3_1_ = (char)((ulong)p_Var59 >> 0x18);
          local_728._4_1_ = (char)((ulong)p_Var59 >> 0x20);
          local_728._5_1_ = (char)((ulong)p_Var59 >> 0x28);
          local_728._6_1_ = (char)((ulong)p_Var59 >> 0x30);
          local_728._7_1_ = (char)((ulong)p_Var59 >> 0x38);
          cStack_720 = (char)extraout_RDX_02;
          cStack_71f = (char)((ulong)extraout_RDX_02 >> 8);
          cStack_71e = (char)((ulong)extraout_RDX_02 >> 0x10);
          cStack_71d = (char)((ulong)extraout_RDX_02 >> 0x18);
          cStack_71c = (char)((ulong)extraout_RDX_02 >> 0x20);
          cStack_71b = (char)((ulong)extraout_RDX_02 >> 0x28);
          cStack_71a = (char)((ulong)extraout_RDX_02 >> 0x30);
          cStack_719 = (char)((ulong)extraout_RDX_02 >> 0x38);
          cVar67 = -(local_728._2_1_ == local_668._2_1_);
          cVar68 = -(local_728._3_1_ == local_668._3_1_);
          cVar69 = -(local_728._4_1_ == local_668._4_1_);
          cVar70 = -(local_728._5_1_ == local_668._5_1_);
          cVar71 = -(local_728._6_1_ == local_668._6_1_);
          cVar72 = -(local_728._7_1_ == local_668._7_1_);
          cVar73 = -(cStack_720 == (char)uStack_660);
          cVar74 = -(cStack_71f == uStack_660._1_1_);
          cVar75 = -(cStack_71e == uStack_660._2_1_);
          cVar76 = -(cStack_71d == uStack_660._3_1_);
          cVar77 = -(cStack_71c == uStack_660._4_1_);
          cVar78 = -(cStack_71b == uStack_660._5_1_);
          cVar80 = -(cStack_71a == uStack_660._6_1_);
          bVar82 = -(cStack_719 == uStack_660._7_1_);
          auVar13[1] = -(local_728._1_1_ == local_668._1_1_);
          auVar13[0] = -((char)local_728 == (char)local_668);
          auVar13[2] = cVar67;
          auVar13[3] = cVar68;
          auVar13[4] = cVar69;
          auVar13[5] = cVar70;
          auVar13[6] = cVar71;
          auVar13[7] = cVar72;
          auVar13[8] = cVar73;
          auVar13[9] = cVar74;
          auVar13[10] = cVar75;
          auVar13[0xb] = cVar76;
          auVar13[0xc] = cVar77;
          auVar13[0xd] = cVar78;
          auVar13[0xe] = cVar80;
          auVar13[0xf] = bVar82;
          auVar14[1] = -(local_728._1_1_ == local_668._1_1_);
          auVar14[0] = -((char)local_728 == (char)local_668);
          auVar14[2] = cVar67;
          auVar14[3] = cVar68;
          auVar14[4] = cVar69;
          auVar14[5] = cVar70;
          auVar14[6] = cVar71;
          auVar14[7] = cVar72;
          auVar14[8] = cVar73;
          auVar14[9] = cVar74;
          auVar14[10] = cVar75;
          auVar14[0xb] = cVar76;
          auVar14[0xc] = cVar77;
          auVar14[0xd] = cVar78;
          auVar14[0xe] = cVar80;
          auVar14[0xf] = bVar82;
          auVar49[1] = cVar68;
          auVar49[0] = cVar67;
          auVar49[2] = cVar69;
          auVar49[3] = cVar70;
          auVar49[4] = cVar71;
          auVar49[5] = cVar72;
          auVar49[6] = cVar73;
          auVar49[7] = cVar74;
          auVar49[8] = cVar75;
          auVar49[9] = cVar76;
          auVar49[10] = cVar77;
          auVar49[0xb] = cVar78;
          auVar49[0xc] = cVar80;
          auVar49[0xd] = bVar82;
          auVar41[1] = cVar69;
          auVar41[0] = cVar68;
          auVar41[2] = cVar70;
          auVar41[3] = cVar71;
          auVar41[4] = cVar72;
          auVar41[5] = cVar73;
          auVar41[6] = cVar74;
          auVar41[7] = cVar75;
          auVar41[8] = cVar76;
          auVar41[9] = cVar77;
          auVar41[10] = cVar78;
          auVar41[0xb] = cVar80;
          auVar41[0xc] = bVar82;
          auVar33[1] = cVar70;
          auVar33[0] = cVar69;
          auVar33[2] = cVar71;
          auVar33[3] = cVar72;
          auVar33[4] = cVar73;
          auVar33[5] = cVar74;
          auVar33[6] = cVar75;
          auVar33[7] = cVar76;
          auVar33[8] = cVar77;
          auVar33[9] = cVar78;
          auVar33[10] = cVar80;
          auVar33[0xb] = bVar82;
          auVar25[1] = cVar71;
          auVar25[0] = cVar70;
          auVar25[2] = cVar72;
          auVar25[3] = cVar73;
          auVar25[4] = cVar74;
          auVar25[5] = cVar75;
          auVar25[6] = cVar76;
          auVar25[7] = cVar77;
          auVar25[8] = cVar78;
          auVar25[9] = cVar80;
          auVar25[10] = bVar82;
          if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB141(auVar49 >> 7,0) & 1) << 2 |
                       (ushort)(SUB131(auVar41 >> 7,0) & 1) << 3 |
                       (ushort)(SUB121(auVar33 >> 7,0) & 1) << 4 |
                       (ushort)(SUB111(auVar25 >> 7,0) & 1) << 5 |
                       (ushort)((byte)(CONCAT19(bVar82,CONCAT18(cVar80,CONCAT17(cVar78,CONCAT16(
                                                  cVar77,CONCAT15(cVar76,CONCAT14(cVar75,CONCAT13(
                                                  cVar74,CONCAT12(cVar73,CONCAT11(cVar72,cVar71)))))
                                                  )))) >> 7) & 1) << 6 |
                       (ushort)((byte)(CONCAT18(bVar82,CONCAT17(cVar80,CONCAT16(cVar78,CONCAT15(
                                                  cVar77,CONCAT14(cVar76,CONCAT13(cVar75,CONCAT12(
                                                  cVar74,CONCAT11(cVar73,cVar72)))))))) >> 7) & 1)
                       << 7 | (ushort)(bVar82 >> 7) << 0xf) == 0xffff) {
            if (((uint)local_700 & 1) == 0) {
              if (((byte)local_700._0_1_ >> 1 & 1) == 0) {
                if (((byte)local_700._0_1_ >> 2 & 1) == 0) {
                  if (((byte)local_700._0_1_ >> 3 & 1) != 0) {
                    local_704 = 3;
                  }
                }
                else {
                  local_704 = 2;
                }
              }
              else {
                local_704 = 1;
              }
            }
            else {
              local_704 = 0;
            }
          }
          else if (((byte)local_700._0_1_ >> 4 & 1) == 0) {
            if (((byte)local_700._0_1_ >> 5 & 1) == 0) {
              if (((byte)local_700._0_1_ >> 6 & 1) == 0) {
                if ((char)local_700._0_1_ < '\0') {
                  local_704 = 0;
                }
              }
              else {
                local_704 = 1;
              }
            }
            else {
              local_704 = 2;
            }
          }
          else {
            local_704 = 3;
          }
          local_770 = uStack_660;
          local_778 = local_668;
          kmer_06[7] = in_stack_fffffffffffff007;
          kmer_06._0_7_ = in_stack_fffffffffffff000;
          kmer_06._8_7_ = in_stack_fffffffffffff008;
          kmer_06[0xf] = in_stack_fffffffffffff00f;
          local_728 = p_Var59;
          kmer_fw_neighbours128((__uint128_t)kmer_06,(uint8_t)(in_stack_ffffffffffffeffc >> 0x18));
          pvVar57 = std::array<unsigned___int128,_4UL>::operator[]
                              ((array<unsigned___int128,_4UL> *)in_stack_ffffffffffffefd0,
                               CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
          local_798 = *(__uint128_t **)pvVar57;
          local_790 = *(undefined8 *)((long)pvVar57 + 8);
          kmer_19[7] = in_stack_fffffffffffff017;
          kmer_19._0_7_ = in_stack_fffffffffffff010;
          kmer_19._8_4_ = in_stack_fffffffffffff018;
          kmer_19._12_4_ = in_stack_fffffffffffff01c;
          local_668 = local_798;
          uStack_660 = local_790;
          local_7a8 = kmer_cannonical128((__uint128_t)kmer_19,in_stack_fffffffffffff00f);
          local_788 = local_7a8;
          uStack_780 = extraout_RDX_03;
          local_7b8 = (unsigned___int128 *)
                      std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::begin
                                ((vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
                                 CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
          local_7c0 = (unsigned___int128 *)
                      std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::end
                                ((vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
                                 CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
          __first_03._M_current._4_4_ = in_stack_ffffffffffffeffc;
          __first_03._M_current._0_4_ = in_stack_ffffffffffffeff8;
          __last_01._M_current._4_4_ = in_stack_ffffffffffffeff4;
          __last_01._M_current._0_4_ = in_stack_ffffffffffffeff0;
          local_7b0 = (unsigned___int128 *)
                      std::
                      lower_bound<__gnu_cxx::__normal_iterator<unsigned__int128_const*,std::vector<unsigned__int128,std::allocator<unsigned__int128>>>,unsigned__int128>
                                (__first_03,__last_01,(unsigned___int128 *)in_stack_ffffffffffffefe8
                                );
          local_7c8 = (unsigned___int128 *)
                      std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>::begin
                                ((vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
                                 CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
          local_670 = __gnu_cxx::operator-
                                ((__normal_iterator<const_unsigned___int128_*,_std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>_>
                                  *)in_stack_ffffffffffffefd0,
                                 (__normal_iterator<const_unsigned___int128_*,_std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>_>
                                  *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
          rVar83 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)
                              CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                              (size_type)in_stack_ffffffffffffefe8);
          local_7d8 = rVar83;
          bVar53 = std::_Bit_reference::operator_cast_to_bool(&local_7d8);
          if (bVar53) break;
          rVar83 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)
                              CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                              (size_type)in_stack_ffffffffffffefe8);
          local_7e8 = rVar83;
          std::_Bit_reference::operator=(&local_7e8,true);
          std::__cxx11::string::push_back((char)local_c8);
          cVar67 = -(local_788._2_1_ == local_668._2_1_);
          cVar68 = -(local_788._3_1_ == local_668._3_1_);
          cVar69 = -(local_788._4_1_ == local_668._4_1_);
          cVar70 = -(local_788._5_1_ == local_668._5_1_);
          cVar71 = -(local_788._6_1_ == local_668._6_1_);
          cVar72 = -(local_788._7_1_ == local_668._7_1_);
          cVar73 = -((char)uStack_780 == (char)uStack_660);
          cVar74 = -(uStack_780._1_1_ == uStack_660._1_1_);
          cVar75 = -(uStack_780._2_1_ == uStack_660._2_1_);
          cVar76 = -(uStack_780._3_1_ == uStack_660._3_1_);
          cVar77 = -(uStack_780._4_1_ == uStack_660._4_1_);
          cVar78 = -(uStack_780._5_1_ == uStack_660._5_1_);
          cVar80 = -(uStack_780._6_1_ == uStack_660._6_1_);
          bVar82 = -(uStack_780._7_1_ == uStack_660._7_1_);
          auVar15[1] = -(local_788._1_1_ == local_668._1_1_);
          auVar15[0] = -((char)local_788 == (char)local_668);
          auVar15[2] = cVar67;
          auVar15[3] = cVar68;
          auVar15[4] = cVar69;
          auVar15[5] = cVar70;
          auVar15[6] = cVar71;
          auVar15[7] = cVar72;
          auVar15[8] = cVar73;
          auVar15[9] = cVar74;
          auVar15[10] = cVar75;
          auVar15[0xb] = cVar76;
          auVar15[0xc] = cVar77;
          auVar15[0xd] = cVar78;
          auVar15[0xe] = cVar80;
          auVar15[0xf] = bVar82;
          auVar16[1] = -(local_788._1_1_ == local_668._1_1_);
          auVar16[0] = -((char)local_788 == (char)local_668);
          auVar16[2] = cVar67;
          auVar16[3] = cVar68;
          auVar16[4] = cVar69;
          auVar16[5] = cVar70;
          auVar16[6] = cVar71;
          auVar16[7] = cVar72;
          auVar16[8] = cVar73;
          auVar16[9] = cVar74;
          auVar16[10] = cVar75;
          auVar16[0xb] = cVar76;
          auVar16[0xc] = cVar77;
          auVar16[0xd] = cVar78;
          auVar16[0xe] = cVar80;
          auVar16[0xf] = bVar82;
          auVar50[1] = cVar68;
          auVar50[0] = cVar67;
          auVar50[2] = cVar69;
          auVar50[3] = cVar70;
          auVar50[4] = cVar71;
          auVar50[5] = cVar72;
          auVar50[6] = cVar73;
          auVar50[7] = cVar74;
          auVar50[8] = cVar75;
          auVar50[9] = cVar76;
          auVar50[10] = cVar77;
          auVar50[0xb] = cVar78;
          auVar50[0xc] = cVar80;
          auVar50[0xd] = bVar82;
          auVar42[1] = cVar69;
          auVar42[0] = cVar68;
          auVar42[2] = cVar70;
          auVar42[3] = cVar71;
          auVar42[4] = cVar72;
          auVar42[5] = cVar73;
          auVar42[6] = cVar74;
          auVar42[7] = cVar75;
          auVar42[8] = cVar76;
          auVar42[9] = cVar77;
          auVar42[10] = cVar78;
          auVar42[0xb] = cVar80;
          auVar42[0xc] = bVar82;
          auVar34[1] = cVar70;
          auVar34[0] = cVar69;
          auVar34[2] = cVar71;
          auVar34[3] = cVar72;
          auVar34[4] = cVar73;
          auVar34[5] = cVar74;
          auVar34[6] = cVar75;
          auVar34[7] = cVar76;
          auVar34[8] = cVar77;
          auVar34[9] = cVar78;
          auVar34[10] = cVar80;
          auVar34[0xb] = bVar82;
          auVar26[1] = cVar71;
          auVar26[0] = cVar70;
          auVar26[2] = cVar72;
          auVar26[3] = cVar73;
          auVar26[4] = cVar74;
          auVar26[5] = cVar75;
          auVar26[6] = cVar76;
          auVar26[7] = cVar77;
          auVar26[8] = cVar78;
          auVar26[9] = cVar80;
          auVar26[10] = bVar82;
          if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB141(auVar50 >> 7,0) & 1) << 2 |
                       (ushort)(SUB131(auVar42 >> 7,0) & 1) << 3 |
                       (ushort)(SUB121(auVar34 >> 7,0) & 1) << 4 |
                       (ushort)(SUB111(auVar26 >> 7,0) & 1) << 5 |
                       (ushort)((byte)(CONCAT19(bVar82,CONCAT18(cVar80,CONCAT17(cVar78,CONCAT16(
                                                  cVar77,CONCAT15(cVar76,CONCAT14(cVar75,CONCAT13(
                                                  cVar74,CONCAT12(cVar73,CONCAT11(cVar72,cVar71)))))
                                                  )))) >> 7) & 1) << 6 |
                       (ushort)((byte)(CONCAT18(bVar82,CONCAT17(cVar80,CONCAT16(cVar78,CONCAT15(
                                                  cVar77,CONCAT14(cVar76,CONCAT13(cVar75,CONCAT12(
                                                  cVar74,CONCAT11(cVar73,cVar72)))))))) >> 7) & 1)
                       << 7 | (ushort)(bVar82 >> 7) << 0xf) == 0xffff) {
            rVar83 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)
                                CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                                (size_type)in_stack_ffffffffffffefe8);
            local_7f8 = rVar83;
            std::_Bit_reference::operator=
                      ((_Bit_reference *)in_stack_ffffffffffffefd0,
                       (_Bit_reference *)
                       CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
          }
          else {
            rVar83 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)
                                CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                                (size_type)in_stack_ffffffffffffefe8);
            in_stack_fffffffffffff0d8 =
                 (vector<klidxs128,_std::allocator<klidxs128>_> *)rVar83._M_mask;
            local_808 = rVar83;
            std::_Bit_reference::operator=
                      ((_Bit_reference *)in_stack_ffffffffffffefd0,
                       (_Bit_reference *)
                       CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
          }
        }
      }
      Node::Node((Node *)CONCAT17(in_stack_ffffffffffffefe7,in_stack_ffffffffffffefe0),
                 (string *)in_stack_ffffffffffffefd8._M_current);
      SequenceDistanceGraph::add_node
                (in_stack_ffffffffffffefd0,
                 (Node *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
      Node::~Node((Node *)0x458513);
      std::vector<Node,_std::allocator<Node>_>::back
                ((vector<Node,_std::allocator<Node>_> *)in_stack_ffffffffffffefd0);
      in_stack_fffffffffffff0cf = Node::is_canonical(in_stack_ffffffffffffefe8);
      if (!(bool)in_stack_fffffffffffff0cf) {
        std::vector<Node,_std::allocator<Node>_>::back
                  ((vector<Node,_std::allocator<Node>_> *)in_stack_ffffffffffffefd0);
        Node::make_rc(in_stack_fffffffffffff050);
      }
    }
LAB_0045858d:
    local_5d0 = local_5d0 + 1;
  } while( true );
}

Assistant:

void GraphMaker::new_graph_from_kmerlist_128(const std::vector<__uint128_t> & kmerlist,uint8_t k) {
    //TODO: add a bloom filter to speed this up
    sg.nodes.clear();
    sg.links.clear();
    sg.oldnames.clear();
    sg.add_node(Node("",NodeStatus::Deleted));
    sdglib::OutputLog()<<"Constructing Graph from "<<kmerlist.size()<<" "<<std::to_string(k)<<"-mers"<<std::endl;
    std::string s;
    s.reserve(1000000); //avoid contig-sequence growth
    std::vector<bool> used_kmers(kmerlist.size());
    std::vector<kcontext> kcontextlist(kmerlist.size());
    std::vector<bool> is_end_fw(kmerlist.size());
    std::vector<bool> is_end_bw(kmerlist.size());
    sdglib::OutputLog()<<"Finding neighbours"<<std::endl;
#pragma omp parallel for
    for (uint64_t i=0;i<kmerlist.size();++i){
        auto fns=kmer_fw_neighbours128(kmerlist[i], k);
        auto &c=kcontextlist[i];
        c.fb.fw=0;
        c.fb.bw=0;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(fns[0],k))) c.sbcont.fA=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(fns[1],k))) c.sbcont.fC=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(fns[2],k))) c.sbcont.fG=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(fns[3],k))) c.sbcont.fT=1;
        auto bns=kmer_bw_neighbours128(kmerlist[i], k);
        if (in_sorted_vector(kmerlist,kmer_cannonical128(bns[0],k))) c.sbcont.bA=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(bns[1],k))) c.sbcont.bC=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(bns[2],k))) c.sbcont.bG=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(bns[3],k))) c.sbcont.bT=1;
    }
    sdglib::OutputLog()<<"Marking ends"<<std::endl;
#pragma omp parallel for
    for (uint64_t i=0;i<kmerlist.size();++i) {
        auto &c=kcontextlist[i];
        if (c.fb.bw!=1 and c.fb.bw!=2 and c.fb.bw!=4 and c.fb.bw!=8 ) {
            is_end_bw[i]=true;
        } else {
            int nn;
            if (c.sbcont.bA) nn=0;
            else if (c.sbcont.bC) nn=1;
            else if (c.sbcont.bG) nn=2;
            else if (c.sbcont.bT) nn=3;
            auto next=kmer_bw_neighbours128(kmerlist[i],k)[nn];
            auto cnext=kmer_cannonical128(next,k);
            auto ni=std::lower_bound(kmerlist.begin(),kmerlist.end(),cnext)-kmerlist.begin();
            auto &nc=kcontextlist[ni];
            if (next==cnext and nc.fb.fw!=1 and nc.fb.fw!=2 and nc.fb.fw!=4 and nc.fb.fw!=8) is_end_bw[i]=true;
            if (next!=cnext and nc.fb.bw!=1 and nc.fb.bw!=2 and nc.fb.bw!=4 and nc.fb.bw!=8) is_end_bw[i]=true;
        }
        if (c.fb.fw!=1 and c.fb.fw!=2 and c.fb.fw!=4 and c.fb.fw!=8 ) {
            is_end_fw[i]=true;
        } else {
            int nn;
            if (c.sbcont.fA) nn=0;
            else if (c.sbcont.fC) nn=1;
            else if (c.sbcont.fG) nn=2;
            else if (c.sbcont.fT) nn=3;
            auto next=kmer_fw_neighbours128(kmerlist[i],k)[nn];
            auto cnext=kmer_cannonical128(next,k);
            auto ni=std::lower_bound(kmerlist.begin(),kmerlist.end(),cnext)-kmerlist.begin();
            auto &nc=kcontextlist[ni];
            if (next==cnext and nc.fb.bw!=1 and nc.fb.bw!=2 and nc.fb.bw!=4 and nc.fb.bw!=8) is_end_fw[i]=true;
            if (next!=cnext and nc.fb.fw!=1 and nc.fb.fw!=2 and nc.fb.fw!=4 and nc.fb.fw!=8) is_end_fw[i]=true;
        }
    }
    sdglib::OutputLog()<<"Creating unitigs"<<std::endl;

    for (uint64_t start_kmer_idx=0;start_kmer_idx<kmerlist.size();++start_kmer_idx) {
        if (used_kmers[start_kmer_idx]) continue; //any kmer can only belong to one unitig.ww

        //Check this k-mer is an end/junction
        auto start_kmer = kmerlist[start_kmer_idx];


        auto end_bw=is_end_bw[start_kmer_idx];
        auto end_fw=is_end_fw[start_kmer_idx];

        if (!end_bw and !end_fw) continue;

        if (end_bw and end_fw) {
            //kmer as unitig
            s=kmer_to_sequence128(start_kmer, k);
            used_kmers[start_kmer_idx] = true;
        } else {
            //unitig start on kmer
            //make sure the unitig starts on FW

            auto current_kmer = start_kmer;
            auto current_idx = start_kmer_idx;
            used_kmers[start_kmer_idx] = true;

            if (end_fw) {
                current_kmer = kmer_reverse128(start_kmer, k);
                std::swap(end_fw,end_bw);
            }

            //Add kmer as unitig
            s=kmer_to_sequence128(current_kmer, k);

            unsigned char nucleotides[4] = {'A', 'C', 'G', 'T'};



            //std::cout<<"Starting sequence construction at kmer "<<kmer_to_sequence128(current_kmer,k)<<std::endl;
            while (!end_fw) {
                //Add end nucleotide, update current_kmer;
                //get_fw_idxs128(fwn, current_kmer, k, kmerlist);
                auto c=kcontextlist[current_idx];
                int nn;
                if (kmer_cannonical128(current_kmer,k)==current_kmer) {
                    if (c.sbcont.fA) nn = 0;
                    else if (c.sbcont.fC) nn = 1;
                    else if (c.sbcont.fG) nn = 2;
                    else if (c.sbcont.fT) nn = 3;
                }
                else{
                    if (c.sbcont.bA) nn = 3;
                    else if (c.sbcont.bC) nn = 2;
                    else if (c.sbcont.bG) nn = 1;
                    else if (c.sbcont.bT) nn = 0;
                }
                current_kmer=kmer_fw_neighbours128(current_kmer,k)[nn];
                auto ccurr=kmer_cannonical128(current_kmer,k);
                current_idx=std::lower_bound(kmerlist.begin(),kmerlist.end(),ccurr)-kmerlist.begin();
                if (used_kmers[current_idx]) break; //this should never happen, since these have ends.
                used_kmers[current_idx]=true;
                s.push_back(nucleotides[current_kmer % 4]);
                if (ccurr==current_kmer) end_fw = is_end_fw[current_idx];
                else end_fw = is_end_bw[current_idx];
            }
        }
        sg.add_node(Node(s));
        if (!sg.nodes.back().is_canonical()) sg.nodes.back().make_rc();//inefficient, but once in a node
    }
    sdglib::OutputLog()<<sg.nodes.size()<<" unitigs"<<std::endl;
    //If there are any perfect circles, they won't have ends, so just pick any unused kmer and go fw till you find the same k-mer fw.
    //(this is going to be even tricker to parallelise)
    sdglib::OutputLog()<<"doing the circles now"<<std::endl;
    for (uint64_t start_kmer_idx=0;start_kmer_idx<kmerlist.size();++start_kmer_idx) {
        if (used_kmers[start_kmer_idx]) continue; //any kmer can only belong to one unitig.ww

        //Check this k-mer is an end/junction
        auto start_kmer = kmerlist[start_kmer_idx];
        std::vector<klidxs128> fwn;
        unsigned char nucleotides[4] = {'A', 'C', 'G', 'T'};
        auto current_kmer = start_kmer;
        used_kmers[start_kmer_idx] = true;
        s=kmer_to_sequence128(current_kmer, k);

        while (true) {
            //Add end nucleotide, update current_kmer;
            get_fw_idxs128(fwn, current_kmer, k, kmerlist);
            current_kmer = fwn[0].kmer;
            if (current_kmer==start_kmer) break;
            used_kmers[fwn[0].idx] = true;
            s.push_back(nucleotides[current_kmer % 4]);
        }
        sg.add_node(Node(s));
        if (!sg.nodes.back().is_canonical()) sg.nodes.back().make_rc();//inefficient, but once in a node
    }
    sdglib::OutputLog()<<sg.nodes.size()<<" unitigs"<<std::endl;

    //save the (k-1)mer in (rev on first k-1 / fw on last k-1) or out ( fw on first k-1 / bw on last k-1)
    std::vector<std::pair<__uint128_t,sgNodeID_t>> in, out;
    in.reserve(2*sg.nodes.size());
    out.reserve(2*sg.nodes.size());
    CStringKMerFactory128 skf_ovl(k-1);
    for (uint64_t nid=1;nid<sg.nodes.size();++nid){
        std::vector<std::pair<__uint128_t,bool>> first,last;
        skf_ovl.create_kmers_direction(first,sg.nodes[nid].sequence.substr(0,k-1).c_str());
        if (first[0].second) out.emplace_back(first[0].first,nid);
        else in.emplace_back(first[0].first,nid);
        skf_ovl.create_kmers_direction(last,sg.nodes[nid].sequence.substr(sg.nodes[nid].sequence.size()-k+1,k-1).c_str());
        if (last[0].second) in.emplace_back(last[0].first,-nid);
        else out.emplace_back(last[0].first,-nid);
    }
    std::sort(in.begin(),in.end());
    std::sort(out.begin(),out.end());
    //connect out->in for all combinations on each kmer
    uint64_t next_out_idx=0;
    for(auto &i:in){
        while(next_out_idx<out.size() and out[next_out_idx].first<i.first) ++next_out_idx;
        for (auto oidx=next_out_idx;oidx<out.size() and out[oidx].first==i.first;++oidx) {
            sg.add_link(i.second,out[oidx].second,-k+1); //no support, although we could add the DBG operation as such
        }
    }
    sdglib::OutputLog()<<"Graph construction finished"<<std::endl;
}